

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  undefined1 uVar1;
  ushort uVar2;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  undefined8 uVar6;
  stbi_uc sVar7;
  bool bVar8;
  byte bVar9;
  char cVar10;
  short sVar11;
  int iVar12;
  uint uVar13;
  stbi__uint32 sVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  stbi__context *psVar21;
  void *pvVar22;
  float *data;
  stbi_uc *psVar23;
  stbi__context *psVar24;
  stbi__context *__s;
  stbi_uc *psVar25;
  stbi_uc *psVar26;
  byte bVar27;
  stbi__uint32 sVar28;
  char *pcVar29;
  stbi_uc *psVar30;
  undefined1 *puVar31;
  byte bVar32;
  uint uVar33;
  stbi_uc *psVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  undefined4 in_register_00000084;
  int *piVar42;
  int *piVar43;
  ulong uVar44;
  stbi__result_info *ri_00;
  ulong uVar45;
  size_t __size;
  ulong uVar46;
  long lVar47;
  long lVar48;
  long *in_FS_OFFSET;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qa_03;
  undefined8 extraout_XMM1_Qa_04;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined8 extraout_XMM1_Qb_03;
  undefined8 extraout_XMM1_Qb_04;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined8 extraout_XMM1_Qa_05;
  undefined8 extraout_XMM1_Qa_06;
  undefined8 extraout_XMM1_Qa_07;
  undefined8 extraout_XMM1_Qa_08;
  undefined8 extraout_XMM1_Qa_09;
  undefined8 extraout_XMM1_Qa_10;
  undefined8 extraout_XMM1_Qa_11;
  undefined8 extraout_XMM1_Qa_12;
  undefined8 extraout_XMM1_Qb_05;
  undefined8 extraout_XMM1_Qb_06;
  undefined8 extraout_XMM1_Qb_07;
  undefined8 extraout_XMM1_Qb_08;
  undefined8 extraout_XMM1_Qb_09;
  undefined8 extraout_XMM1_Qb_10;
  undefined8 extraout_XMM1_Qb_11;
  undefined8 extraout_XMM1_Qb_12;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  int iVar118;
  float fVar119;
  int iVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  int iVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar128 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  int iVar161;
  int iVar165;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  stbi_uc pal [256] [4];
  uint local_89a0;
  uint local_8990;
  char *local_8988;
  void *local_8968;
  void *local_8960;
  uint local_8938;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  piVar42 = (int *)CONCAT44(in_register_00000084,req_comp);
  piVar42[0] = 8;
  piVar42[1] = 0;
  piVar42[2] = 0;
  piVar43 = piVar42;
  ri_00 = ri;
  iVar12 = stbi__check_png_header(s);
  uVar41 = (uint)piVar43;
  psVar30 = s->img_buffer_original;
  psVar23 = s->img_buffer_original_end;
  s->img_buffer = psVar30;
  s->img_buffer_end = psVar23;
  if (iVar12 != 0) {
    local_88a8._0_8_ = s;
    iVar12 = stbi__parse_png_file((stbi__png *)&local_88a8,0,4);
    uVar6 = local_88a8._0_8_;
    if (iVar12 == 0) {
      psVar21 = (stbi__context *)0x0;
      psVar24 = (stbi__context *)local_88a8.history;
    }
    else {
      psVar21 = (stbi__context *)local_88a8.history;
      if (local_88a8.flags < 9) {
        *piVar42 = 8;
        if (*(int *)(local_88a8._0_8_ + 0xc) != 4) {
          psVar21 = (stbi__context *)
                    stbi__convert_format
                              (local_88a8.history,*(int *)(local_88a8._0_8_ + 0xc),
                               *(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4),uVar41);
LAB_0043995b:
          *(int *)(uVar6 + 0xc) = 4;
          if (psVar21 == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
      }
      else {
        if (local_88a8.flags != 0x10) {
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "bad bits_per_channel";
          goto LAB_0043a2c6;
        }
        *piVar42 = 0x10;
        if (*(int *)(local_88a8._0_8_ + 0xc) != 4) {
          psVar21 = (stbi__context *)
                    stbi__convert_format16
                              ((stbi__uint16 *)local_88a8.history,*(int *)(local_88a8._0_8_ + 0xc),
                               *(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4),uVar41);
          goto LAB_0043995b;
        }
      }
      *x = *(stbi__uint32 *)uVar6;
      *y = *(stbi__uint32 *)(uVar6 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar6 + 8);
      }
      psVar24 = (stbi__context *)0x0;
    }
    free(psVar24);
    free(local_88a8.background);
    psVar24 = (stbi__context *)local_88a8.out;
    goto LAB_004399a5;
  }
  if (psVar30 < psVar23) {
    psVar34 = psVar30 + 1;
    s->img_buffer = psVar34;
    sVar7 = *psVar30;
LAB_00439a31:
    if (sVar7 != 'B') goto LAB_00439c05;
    if (psVar34 < psVar23) {
      s->img_buffer = psVar34 + 1;
      sVar7 = *psVar34;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00439c05;
      psVar23 = s->buffer_start;
      iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      psVar30 = s->img_buffer_original;
      s->callback_already_read = s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
      if (iVar12 == 0) {
        s->read_from_callbacks = 0;
        psVar34 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar7 = '\0';
      }
      else {
        psVar34 = psVar23 + iVar12;
        sVar7 = *psVar23;
      }
      s->img_buffer_end = psVar34;
      s->img_buffer = s->buffer_start + 1;
    }
    if (sVar7 != 'M') goto LAB_00439c05;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar13 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    uVar13 = iVar12 << 0x10 | uVar13;
    if (((0x38 < uVar13) || ((0x100010000001000U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
       (uVar13 != 0x6c)) {
      psVar30 = s->img_buffer_original;
      psVar23 = s->img_buffer_original_end;
      s->img_buffer = psVar30;
      s->img_buffer_end = psVar23;
      if (uVar13 == 0x7c) goto LAB_00439b38;
      goto LAB_00439c1a;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00439b38:
    local_88cc.all_a = 0xff;
    pvVar22 = stbi__bmp_parse_header(s,&local_88cc);
    local_8938 = local_88cc.all_a;
    if (pvVar22 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar41 = s->img_y;
    uVar13 = -uVar41;
    if (0 < (int)uVar41) {
      uVar13 = uVar41;
    }
    s->img_y = uVar13;
    if ((uVar13 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88cc.hsz == 0xc) {
        if (0x17 < local_88cc.bpp) goto LAB_00439f26;
        uVar13 = ((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3;
LAB_00439e5f:
        uVar44 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_00439f26;
        bVar4 = false;
LAB_00439e89:
        bVar8 = local_88cc.ma == 0xff000000;
        local_89a0 = local_88cc.bpp;
        iVar12 = 4 - (uint)(local_88cc.ma == 0);
      }
      else {
        if (local_88cc.bpp < 0x10) {
          uVar13 = local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2;
          goto LAB_00439e5f;
        }
LAB_00439f26:
        iVar12 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar12 - 0x401U < 0xfffffc00) {
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "bad header";
          goto LAB_0043a2c6;
        }
        if ((local_88cc.offset < iVar12) || (0x400 < local_88cc.offset - iVar12)) {
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "bad offset";
          goto LAB_0043a2c6;
        }
        stbi__skip(s,local_88cc.offset - iVar12);
        uVar44 = 0;
        bVar8 = true;
        bVar4 = bVar8;
        if (local_88cc.bpp != 0x18 || local_88cc.ma != 0xff000000) goto LAB_00439e89;
        iVar12 = 3;
        local_89a0 = 0x18;
        bVar4 = true;
      }
      s->img_n = iVar12;
      sVar14 = s->img_x;
      sVar28 = s->img_y;
      iVar12 = stbi__mad3sizes_valid(4,sVar14,sVar28,0);
      if (iVar12 == 0) goto LAB_0043a2b3;
      pvVar22 = stbi__malloc_mad3(4,sVar14,sVar28,0);
      if (pvVar22 != (void *)0x0) {
        if ((int)local_89a0 < 0x10) {
          iVar12 = (int)uVar44;
          if (!bVar4 && iVar12 < 0x101) {
            if (0 < iVar12) {
              psVar23 = s->buffer_start;
              psVar30 = s->buffer_start + 1;
              psVar34 = s->img_buffer;
              psVar26 = s->img_buffer_end;
              uVar46 = 0;
              do {
                if (psVar34 < psVar26) {
                  s->img_buffer = psVar34 + 1;
                  sVar7 = *psVar34;
                  psVar34 = psVar34 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar7 = '\0';
                }
                else {
                  iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  in_XMM1._8_8_ = extraout_XMM1_Qb_01;
                  in_XMM1._0_8_ = extraout_XMM1_Qa_01;
                  s->callback_already_read =
                       s->callback_already_read +
                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                  if (iVar37 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar7 = '\0';
                    psVar26 = psVar30;
                  }
                  else {
                    sVar7 = *psVar23;
                    psVar26 = psVar23 + iVar37;
                  }
                  s->img_buffer_end = psVar26;
                  s->img_buffer = psVar30;
                  psVar34 = psVar30;
                }
                local_88a8.pal[uVar46 - 0xd][2] = sVar7;
                if (psVar34 < psVar26) {
                  s->img_buffer = psVar34 + 1;
                  sVar7 = *psVar34;
                  psVar34 = psVar34 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar7 = '\0';
                }
                else {
                  iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  in_XMM1._8_8_ = extraout_XMM1_Qb_02;
                  in_XMM1._0_8_ = extraout_XMM1_Qa_02;
                  s->callback_already_read =
                       s->callback_already_read +
                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                  if (iVar37 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar7 = '\0';
                    psVar26 = psVar30;
                  }
                  else {
                    sVar7 = *psVar23;
                    psVar26 = psVar23 + iVar37;
                  }
                  s->img_buffer_end = psVar26;
                  s->img_buffer = psVar30;
                  psVar34 = psVar30;
                }
                local_88a8.pal[uVar46 - 0xd][1] = sVar7;
                if (psVar34 < psVar26) {
                  s->img_buffer = psVar34 + 1;
                  sVar7 = *psVar34;
                  psVar34 = psVar34 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar7 = '\0';
                }
                else {
                  iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  in_XMM1._8_8_ = extraout_XMM1_Qb_03;
                  in_XMM1._0_8_ = extraout_XMM1_Qa_03;
                  s->callback_already_read =
                       s->callback_already_read +
                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                  if (iVar37 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar7 = '\0';
                    psVar26 = psVar30;
                  }
                  else {
                    sVar7 = *psVar23;
                    psVar26 = psVar23 + iVar37;
                  }
                  s->img_buffer_end = psVar26;
                  s->img_buffer = psVar30;
                  psVar34 = psVar30;
                }
                local_88a8.pal[uVar46 - 0xd][0] = sVar7;
                if (local_88cc.hsz != 0xc) {
                  if (psVar34 < psVar26) {
                    psVar34 = psVar34 + 1;
                  }
                  else {
                    if (s->read_from_callbacks == 0) goto LAB_0043acf0;
                    iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    in_XMM1._8_8_ = extraout_XMM1_Qb_04;
                    in_XMM1._0_8_ = extraout_XMM1_Qa_04;
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar37 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      psVar26 = psVar30;
                    }
                    else {
                      psVar26 = psVar23 + iVar37;
                    }
                    s->img_buffer_end = psVar26;
                    psVar34 = psVar30;
                  }
                  s->img_buffer = psVar34;
                }
LAB_0043acf0:
                local_88a8.pal[uVar46 - 0xd][3] = 0xff;
                uVar46 = uVar46 + 1;
              } while (uVar44 != uVar46);
            }
            stbi__skip(s,(iVar12 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (local_89a0 == 1) {
              sVar14 = s->img_y;
              if (0 < (int)sVar14) {
                sVar28 = s->img_x;
                psVar23 = s->buffer_start;
                psVar30 = s->buffer_start + 1;
                iVar12 = 0;
                iVar37 = 0;
                do {
                  psVar34 = s->img_buffer;
                  psVar26 = s->img_buffer_end;
                  if (psVar34 < psVar26) {
                    s->img_buffer = psVar34 + 1;
                    bVar9 = *psVar34;
                    psVar34 = psVar34 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                  }
                  else {
                    iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    in_XMM1._8_8_ = extraout_XMM1_Qb_11;
                    in_XMM1._0_8_ = extraout_XMM1_Qa_11;
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar35 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar26 = psVar30;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar26 = psVar23 + iVar35;
                    }
                    s->img_buffer_end = psVar26;
                    s->img_buffer = psVar30;
                    psVar34 = psVar30;
                  }
                  sVar14 = s->img_x;
                  if (0 < (int)sVar14) {
                    uVar40 = (uint)bVar9;
                    lVar39 = (long)iVar12;
                    uVar13 = 7;
                    lVar48 = 0;
                    do {
                      iVar12 = iVar12 + 4;
                      uVar44 = (ulong)((uVar40 >> (uVar13 & 0x1f) & 1) != 0);
                      *(stbi_uc *)((long)pvVar22 + lVar48 * 4 + lVar39) =
                           local_88a8.pal[uVar44 - 0xd][0];
                      *(stbi_uc *)((long)pvVar22 + lVar48 * 4 + lVar39 + 1U) =
                           local_88a8.pal[uVar44 - 0xd][1];
                      *(stbi_uc *)((long)pvVar22 + lVar48 * 4 + lVar39 + 2U) =
                           local_88a8.pal[uVar44 - 0xd][2];
                      *(undefined1 *)((long)pvVar22 + lVar48 * 4 + lVar39 + 3U) = 0xff;
                      if ((int)lVar48 + 1U == sVar14) break;
                      if ((int)uVar13 < 1) {
                        if (psVar34 < psVar26) {
                          s->img_buffer = psVar34 + 1;
                          uVar40 = (uint)*psVar34;
                          psVar34 = psVar34 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar40 = 0;
                        }
                        else {
                          iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                          in_XMM1._8_8_ = extraout_XMM1_Qb_12;
                          in_XMM1._0_8_ = extraout_XMM1_Qa_12;
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar35 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar40 = 0;
                            psVar26 = psVar30;
                          }
                          else {
                            uVar40 = (uint)*psVar23;
                            psVar26 = psVar23 + iVar35;
                          }
                          s->img_buffer_end = psVar26;
                          s->img_buffer = psVar30;
                          sVar14 = s->img_x;
                          psVar34 = psVar30;
                        }
                        uVar13 = 7;
                      }
                      else {
                        uVar13 = uVar13 - 1;
                      }
                      lVar48 = lVar48 + 1;
                    } while ((int)lVar48 < (int)sVar14);
                  }
                  stbi__skip(s,-(sVar28 + 7 >> 3) & 3);
                  iVar37 = iVar37 + 1;
                  sVar14 = s->img_y;
                } while (iVar37 < (int)sVar14);
              }
            }
            else {
              if (local_89a0 == 8) {
                uVar13 = s->img_x;
              }
              else {
                if (local_89a0 != 4) {
                  free(pvVar22);
                  lVar39 = *in_FS_OFFSET;
                  pcVar29 = "bad bpp";
                  goto LAB_0043a2c6;
                }
                uVar13 = s->img_x + 1 >> 1;
              }
              sVar14 = s->img_y;
              if (0 < (int)sVar14) {
                psVar23 = s->buffer_start;
                psVar30 = s->buffer_start + 1;
                iVar12 = 0;
                iVar37 = 0;
                do {
                  sVar14 = s->img_x;
                  if (0 < (int)sVar14) {
                    lVar48 = (long)iVar12;
                    psVar34 = s->img_buffer;
                    psVar25 = s->img_buffer_end;
                    lVar39 = 0;
                    iVar35 = 0;
                    psVar26 = psVar34;
                    do {
                      if (psVar26 < psVar25) {
                        psVar34 = psVar26 + 1;
                        s->img_buffer = psVar34;
                        bVar9 = *psVar26;
                        psVar26 = psVar34;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar9 = 0;
                      }
                      else {
                        iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                        in_XMM1._8_8_ = extraout_XMM1_Qb_09;
                        in_XMM1._0_8_ = extraout_XMM1_Qa_09;
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar20 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar9 = 0;
                          psVar25 = psVar30;
                        }
                        else {
                          bVar9 = *psVar23;
                          psVar25 = psVar23 + iVar20;
                        }
                        s->img_buffer_end = psVar25;
                        s->img_buffer = psVar30;
                        sVar14 = s->img_x;
                        psVar34 = psVar30;
                        psVar26 = psVar30;
                      }
                      bVar32 = bVar9 >> 4;
                      if (local_89a0 != 4) {
                        bVar32 = bVar9;
                      }
                      uVar44 = (ulong)bVar32;
                      *(stbi_uc *)((long)pvVar22 + lVar39 * 4 + lVar48) =
                           local_88a8.pal[uVar44 - 0xd][0];
                      *(stbi_uc *)((long)pvVar22 + lVar39 * 4 + lVar48 + 1U) =
                           local_88a8.pal[uVar44 - 0xd][1];
                      *(stbi_uc *)((long)pvVar22 + lVar39 * 4 + lVar48 + 2U) =
                           local_88a8.pal[uVar44 - 0xd][2];
                      *(undefined1 *)((long)pvVar22 + lVar39 * 4 + lVar48 + 3U) = 0xff;
                      if ((int)lVar39 + 1U == sVar14) {
                        iVar12 = (iVar12 - iVar35) + 4;
                        goto LAB_0043c685;
                      }
                      uVar40 = bVar9 & 0xf;
                      if (local_89a0 != 4) {
                        uVar40 = 0;
                      }
                      if (local_89a0 == 8) {
                        if (psVar34 < psVar25) {
                          psVar26 = psVar34 + 1;
                          s->img_buffer = psVar26;
                          uVar40 = (uint)*psVar34;
                          psVar34 = psVar26;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar40 = 0;
                          psVar26 = psVar34;
                        }
                        else {
                          iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                          in_XMM1._8_8_ = extraout_XMM1_Qb_10;
                          in_XMM1._0_8_ = extraout_XMM1_Qa_10;
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar20 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar40 = 0;
                            psVar25 = psVar30;
                          }
                          else {
                            uVar40 = (uint)*psVar23;
                            psVar25 = psVar23 + iVar20;
                          }
                          s->img_buffer_end = psVar25;
                          s->img_buffer = psVar30;
                          sVar14 = s->img_x;
                          psVar34 = psVar30;
                          psVar26 = psVar30;
                        }
                      }
                      uVar44 = (ulong)uVar40;
                      *(stbi_uc *)((long)pvVar22 + lVar39 * 4 + lVar48 + 4U) =
                           local_88a8.pal[uVar44 - 0xd][0];
                      *(stbi_uc *)((long)pvVar22 + lVar39 * 4 + lVar48 + 5U) =
                           local_88a8.pal[uVar44 - 0xd][1];
                      *(stbi_uc *)((long)pvVar22 + lVar39 * 4 + lVar48 + 6U) =
                           local_88a8.pal[uVar44 - 0xd][2];
                      *(undefined1 *)((long)pvVar22 + lVar39 * 4 + lVar48 + 7U) = 0xff;
                      iVar35 = iVar35 + -8;
                      lVar39 = lVar39 + 2;
                    } while ((int)lVar39 < (int)sVar14);
                    iVar12 = iVar12 - iVar35;
                  }
LAB_0043c685:
                  stbi__skip(s,-uVar13 & 3);
                  iVar37 = iVar37 + 1;
                  sVar14 = s->img_y;
                } while (iVar37 < (int)sVar14);
              }
            }
            goto LAB_0043c8b4;
          }
          free(pvVar22);
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "invalid";
          goto LAB_0043a2c6;
        }
        stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
        if (local_89a0 != 0x10) {
          if (local_89a0 == 0x20) {
            uVar13 = 0;
            if ((bool)((local_88cc.mr == 0xff0000 &&
                       (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff)) & bVar8)) {
              bVar4 = true;
              goto LAB_0043b4a5;
            }
            goto LAB_0043b4fd;
          }
          uVar13 = 0;
          if (local_89a0 != 0x18) goto LAB_0043b4fd;
          uVar13 = s->img_x & 3;
          bVar4 = false;
LAB_0043b4a5:
          bVar8 = false;
          iVar12 = 0;
          iVar37 = 0;
          iVar35 = 0;
          iVar20 = 0;
          uVar40 = 0;
          uVar15 = 0;
          uVar16 = 0;
          uVar17 = 0;
LAB_0043c043:
          sVar14 = s->img_y;
          if (0 < (int)sVar14) {
            psVar23 = s->buffer_start;
            psVar30 = s->buffer_start + 1;
            iVar165 = 0;
            iVar161 = 0;
            do {
              if (bVar8) {
                if (0 < (int)s->img_x) {
                  lVar48 = (long)iVar165;
                  lVar39 = 0;
                  do {
                    uVar18 = stbi__get16le(s);
                    if (local_89a0 != 0x10) {
                      iVar19 = stbi__get16le(s);
                      uVar18 = uVar18 | iVar19 << 0x10;
                    }
                    iVar19 = stbi__shiftsigned(uVar18 & local_88cc.mr,iVar12,uVar40);
                    *(char *)((long)pvVar22 + lVar39 * 4 + lVar48) = (char)iVar19;
                    iVar19 = stbi__shiftsigned(uVar18 & local_88cc.mg,iVar37,uVar15);
                    *(char *)((long)pvVar22 + lVar39 * 4 + lVar48 + 1U) = (char)iVar19;
                    iVar19 = stbi__shiftsigned(uVar18 & local_88cc.mb,iVar35,uVar16);
                    *(char *)((long)pvVar22 + lVar39 * 4 + lVar48 + 2U) = (char)iVar19;
                    if (local_88cc.ma == 0) {
                      uVar18 = 0xff;
                    }
                    else {
                      uVar18 = stbi__shiftsigned(uVar18 & local_88cc.ma,iVar20,uVar17);
                    }
                    local_8938 = local_8938 | uVar18;
                    *(char *)((long)pvVar22 + lVar39 * 4 + lVar48 + 3U) = (char)uVar18;
                    iVar165 = iVar165 + 4;
                    lVar39 = lVar39 + 1;
                  } while ((int)lVar39 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                lVar39 = (long)iVar165;
                psVar34 = s->img_buffer;
                psVar25 = s->img_buffer_end;
                lVar48 = 0;
                psVar26 = psVar34;
                do {
                  if (psVar26 < psVar25) {
                    psVar34 = psVar26 + 1;
                    s->img_buffer = psVar34;
                    bVar9 = *psVar26;
                    psVar26 = psVar34;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                  }
                  else {
                    iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    in_XMM1._8_8_ = extraout_XMM1_Qb_05;
                    in_XMM1._0_8_ = extraout_XMM1_Qa_05;
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar19 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar25 = psVar30;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar25 = psVar23 + iVar19;
                    }
                    s->img_buffer_end = psVar25;
                    s->img_buffer = psVar30;
                    psVar34 = psVar30;
                    psVar26 = psVar30;
                  }
                  *(byte *)((long)pvVar22 + lVar48 * 4 + lVar39 + 2U) = bVar9;
                  if (psVar26 < psVar25) {
                    psVar34 = psVar26 + 1;
                    s->img_buffer = psVar34;
                    bVar9 = *psVar26;
                    psVar26 = psVar34;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                  }
                  else {
                    iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    in_XMM1._8_8_ = extraout_XMM1_Qb_06;
                    in_XMM1._0_8_ = extraout_XMM1_Qa_06;
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar19 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar25 = psVar30;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar25 = psVar23 + iVar19;
                    }
                    s->img_buffer_end = psVar25;
                    s->img_buffer = psVar30;
                    psVar34 = psVar30;
                    psVar26 = psVar30;
                  }
                  *(byte *)((long)pvVar22 + lVar48 * 4 + lVar39 + 1U) = bVar9;
                  if (psVar26 < psVar25) {
                    psVar34 = psVar26 + 1;
                    s->img_buffer = psVar34;
                    bVar9 = *psVar26;
                    psVar26 = psVar34;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                  }
                  else {
                    iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    in_XMM1._8_8_ = extraout_XMM1_Qb_07;
                    in_XMM1._0_8_ = extraout_XMM1_Qa_07;
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar19 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar25 = psVar30;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar25 = psVar23 + iVar19;
                    }
                    s->img_buffer_end = psVar25;
                    s->img_buffer = psVar30;
                    psVar34 = psVar30;
                    psVar26 = psVar30;
                  }
                  *(byte *)((long)pvVar22 + lVar48 * 4 + lVar39) = bVar9;
                  bVar9 = 0xff;
                  if (bVar4) {
                    if (psVar34 < psVar25) {
                      psVar26 = psVar34 + 1;
                      s->img_buffer = psVar26;
                      bVar9 = *psVar34;
                      psVar34 = psVar26;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar9 = 0;
                      psVar26 = psVar34;
                    }
                    else {
                      iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      in_XMM1._8_8_ = extraout_XMM1_Qb_08;
                      in_XMM1._0_8_ = extraout_XMM1_Qa_08;
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar19 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar25 = psVar30;
                      }
                      else {
                        bVar9 = *psVar23;
                        psVar25 = psVar23 + iVar19;
                      }
                      s->img_buffer_end = psVar25;
                      s->img_buffer = psVar30;
                      psVar34 = psVar30;
                      psVar26 = psVar30;
                    }
                  }
                  local_8938 = local_8938 | bVar9;
                  *(byte *)((long)pvVar22 + lVar48 * 4 + lVar39 + 3U) = bVar9;
                  iVar165 = iVar165 + 4;
                  lVar48 = lVar48 + 1;
                } while ((int)lVar48 < (int)s->img_x);
              }
              stbi__skip(s,uVar13);
              iVar161 = iVar161 + 1;
              sVar14 = s->img_y;
            } while (iVar161 < (int)sVar14);
          }
LAB_0043c8b4:
          auVar80 = _DAT_005eb8b0;
          auVar133 = _DAT_005eb8a0;
          auVar76 = _DAT_005eb870;
          auVar57 = _DAT_005eb860;
          auVar135 = _DAT_005ce320;
          auVar51 = _DAT_005ce310;
          auVar128 = _DAT_005ce300;
          if ((local_8938 == 0) && (uVar13 = s->img_x * sVar14 * 4 - 1, -1 < (int)uVar13)) {
            uVar40 = uVar13 >> 2;
            auVar55._4_4_ = 0;
            auVar55._0_4_ = uVar40;
            auVar55._8_4_ = uVar40;
            auVar55._12_4_ = 0;
            puVar31 = (undefined1 *)((long)pvVar22 + (ulong)uVar13);
            uVar44 = 0;
            auVar136._8_4_ = 0xffffffff;
            auVar136._0_8_ = 0xffffffffffffffff;
            auVar136._12_4_ = 0xffffffff;
            do {
              auVar137._8_4_ = (int)uVar44;
              auVar137._0_8_ = uVar44;
              auVar137._12_4_ = (int)(uVar44 >> 0x20);
              auVar139 = auVar55 | auVar51;
              auVar141 = (auVar137 | auVar128) ^ auVar51;
              iVar12 = auVar139._0_4_;
              iVar161 = -(uint)(iVar12 < auVar141._0_4_);
              iVar37 = auVar139._4_4_;
              auVar143._4_4_ = -(uint)(iVar37 < auVar141._4_4_);
              iVar35 = auVar139._8_4_;
              iVar165 = -(uint)(iVar35 < auVar141._8_4_);
              iVar20 = auVar139._12_4_;
              auVar143._12_4_ = -(uint)(iVar20 < auVar141._12_4_);
              auVar154._4_4_ = iVar161;
              auVar154._0_4_ = iVar161;
              auVar154._8_4_ = iVar165;
              auVar154._12_4_ = iVar165;
              auVar139 = pshuflw(in_XMM1,auVar154,0xe8);
              auVar142._4_4_ = -(uint)(auVar141._4_4_ == iVar37);
              auVar142._12_4_ = -(uint)(auVar141._12_4_ == iVar20);
              auVar142._0_4_ = auVar142._4_4_;
              auVar142._8_4_ = auVar142._12_4_;
              auVar92 = pshuflw(in_XMM2,auVar142,0xe8);
              auVar143._0_4_ = auVar143._4_4_;
              auVar143._8_4_ = auVar143._12_4_;
              auVar141 = pshuflw(auVar139,auVar143,0xe8);
              auVar139 = (auVar141 | auVar92 & auVar139) ^ auVar136;
              auVar139 = packssdw(auVar139,auVar139);
              if ((auVar139 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar31 = 0xff;
              }
              auVar143 = auVar142 & auVar154 | auVar143;
              auVar139 = packssdw(auVar143,auVar143);
              auVar139 = packssdw(auVar139 ^ auVar136,auVar139 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._0_4_ >> 8 & 1) != 0) {
                puVar31[-4] = 0xff;
              }
              auVar139 = (auVar137 | auVar135) ^ auVar51;
              auVar93._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar93._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar93._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar93._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar144._4_4_ = auVar93._0_4_;
              auVar144._0_4_ = auVar93._0_4_;
              auVar144._8_4_ = auVar93._8_4_;
              auVar144._12_4_ = auVar93._8_4_;
              iVar161 = -(uint)(auVar139._4_4_ == iVar37);
              iVar165 = -(uint)(auVar139._12_4_ == iVar20);
              auVar155._4_4_ = iVar161;
              auVar155._0_4_ = iVar161;
              auVar155._8_4_ = iVar165;
              auVar155._12_4_ = iVar165;
              auVar162._4_4_ = auVar93._4_4_;
              auVar162._0_4_ = auVar93._4_4_;
              auVar162._8_4_ = auVar93._12_4_;
              auVar162._12_4_ = auVar93._12_4_;
              auVar139 = auVar155 & auVar144 | auVar162;
              auVar139 = packssdw(auVar139,auVar139);
              auVar139 = packssdw(auVar139 ^ auVar136,auVar139 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._0_4_ >> 0x10 & 1) != 0) {
                puVar31[-8] = 0xff;
              }
              auVar139 = pshufhw(auVar139,auVar144,0x84);
              auVar92 = pshufhw(auVar93,auVar155,0x84);
              auVar141 = pshufhw(auVar139,auVar162,0x84);
              auVar139 = (auVar141 | auVar92 & auVar139) ^ auVar136;
              auVar139 = packssdw(auVar139,auVar139);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._0_4_ >> 0x18 & 1) != 0) {
                puVar31[-0xc] = 0xff;
              }
              auVar139 = (auVar137 | auVar76) ^ auVar51;
              auVar94._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar94._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar94._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar94._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar156._4_4_ = auVar94._0_4_;
              auVar156._0_4_ = auVar94._0_4_;
              auVar156._8_4_ = auVar94._8_4_;
              auVar156._12_4_ = auVar94._8_4_;
              auVar92 = pshuflw(auVar162,auVar156,0xe8);
              auVar60._0_4_ = -(uint)(auVar139._0_4_ == iVar12);
              auVar60._4_4_ = -(uint)(auVar139._4_4_ == iVar37);
              auVar60._8_4_ = -(uint)(auVar139._8_4_ == iVar35);
              auVar60._12_4_ = -(uint)(auVar139._12_4_ == iVar20);
              auVar145._4_4_ = auVar60._4_4_;
              auVar145._0_4_ = auVar60._4_4_;
              auVar145._8_4_ = auVar60._12_4_;
              auVar145._12_4_ = auVar60._12_4_;
              auVar139 = pshuflw(auVar60,auVar145,0xe8);
              auVar146._4_4_ = auVar94._4_4_;
              auVar146._0_4_ = auVar94._4_4_;
              auVar146._8_4_ = auVar94._12_4_;
              auVar146._12_4_ = auVar94._12_4_;
              auVar141 = pshuflw(auVar94,auVar146,0xe8);
              auVar139 = packssdw(auVar139 & auVar92,(auVar141 | auVar139 & auVar92) ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar31[-0x10] = 0xff;
              }
              auVar146 = auVar145 & auVar156 | auVar146;
              auVar141 = packssdw(auVar146,auVar146);
              auVar139 = packssdw(auVar139,auVar141 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._4_2_ >> 8 & 1) != 0) {
                puVar31[-0x14] = 0xff;
              }
              auVar139 = (auVar137 | auVar57) ^ auVar51;
              auVar95._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar95._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar95._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar95._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar147._4_4_ = auVar95._0_4_;
              auVar147._0_4_ = auVar95._0_4_;
              auVar147._8_4_ = auVar95._8_4_;
              auVar147._12_4_ = auVar95._8_4_;
              iVar161 = -(uint)(auVar139._4_4_ == iVar37);
              iVar165 = -(uint)(auVar139._12_4_ == iVar20);
              auVar157._4_4_ = iVar161;
              auVar157._0_4_ = iVar161;
              auVar157._8_4_ = iVar165;
              auVar157._12_4_ = iVar165;
              auVar163._4_4_ = auVar95._4_4_;
              auVar163._0_4_ = auVar95._4_4_;
              auVar163._8_4_ = auVar95._12_4_;
              auVar163._12_4_ = auVar95._12_4_;
              auVar139 = auVar157 & auVar147 | auVar163;
              auVar139 = packssdw(auVar139,auVar139);
              auVar139 = packssdw(auVar139 ^ auVar136,auVar139 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar31[-0x18] = 0xff;
              }
              auVar139 = pshufhw(auVar139,auVar147,0x84);
              auVar92 = pshufhw(auVar95,auVar157,0x84);
              auVar141 = pshufhw(auVar139,auVar163,0x84);
              auVar139 = (auVar141 | auVar92 & auVar139) ^ auVar136;
              auVar139 = packssdw(auVar139,auVar139);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._6_2_ >> 8 & 1) != 0) {
                puVar31[-0x1c] = 0xff;
              }
              auVar139 = (auVar137 | auVar80) ^ auVar51;
              auVar96._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar96._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar96._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar96._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar158._4_4_ = auVar96._0_4_;
              auVar158._0_4_ = auVar96._0_4_;
              auVar158._8_4_ = auVar96._8_4_;
              auVar158._12_4_ = auVar96._8_4_;
              auVar92 = pshuflw(auVar163,auVar158,0xe8);
              auVar61._0_4_ = -(uint)(auVar139._0_4_ == iVar12);
              auVar61._4_4_ = -(uint)(auVar139._4_4_ == iVar37);
              auVar61._8_4_ = -(uint)(auVar139._8_4_ == iVar35);
              auVar61._12_4_ = -(uint)(auVar139._12_4_ == iVar20);
              auVar148._4_4_ = auVar61._4_4_;
              auVar148._0_4_ = auVar61._4_4_;
              auVar148._8_4_ = auVar61._12_4_;
              auVar148._12_4_ = auVar61._12_4_;
              auVar139 = pshuflw(auVar61,auVar148,0xe8);
              auVar149._4_4_ = auVar96._4_4_;
              auVar149._0_4_ = auVar96._4_4_;
              auVar149._8_4_ = auVar96._12_4_;
              auVar149._12_4_ = auVar96._12_4_;
              auVar141 = pshuflw(auVar96,auVar149,0xe8);
              auVar141 = (auVar141 | auVar139 & auVar92) ^ auVar136;
              auVar141 = packssdw(auVar141,auVar141);
              auVar139 = packsswb(auVar139 & auVar92,auVar141);
              if ((auVar139 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar31[-0x20] = 0xff;
              }
              auVar149 = auVar148 & auVar158 | auVar149;
              auVar141 = packssdw(auVar149,auVar149);
              auVar141 = packssdw(auVar141 ^ auVar136,auVar141 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar141);
              if ((auVar139._8_2_ >> 8 & 1) != 0) {
                puVar31[-0x24] = 0xff;
              }
              auVar139 = (auVar137 | auVar133) ^ auVar51;
              auVar97._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar97._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar97._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar97._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar150._4_4_ = auVar97._0_4_;
              auVar150._0_4_ = auVar97._0_4_;
              auVar150._8_4_ = auVar97._8_4_;
              auVar150._12_4_ = auVar97._8_4_;
              iVar161 = -(uint)(auVar139._4_4_ == iVar37);
              iVar165 = -(uint)(auVar139._12_4_ == iVar20);
              auVar159._4_4_ = iVar161;
              auVar159._0_4_ = iVar161;
              auVar159._8_4_ = iVar165;
              auVar159._12_4_ = iVar165;
              auVar164._4_4_ = auVar97._4_4_;
              auVar164._0_4_ = auVar97._4_4_;
              auVar164._8_4_ = auVar97._12_4_;
              auVar164._12_4_ = auVar97._12_4_;
              auVar139 = auVar159 & auVar150 | auVar164;
              auVar139 = packssdw(auVar139,auVar139);
              auVar139 = packssdw(auVar139 ^ auVar136,auVar139 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar31[-0x28] = 0xff;
              }
              auVar139 = pshufhw(auVar139,auVar150,0x84);
              auVar92 = pshufhw(auVar97,auVar159,0x84);
              auVar141 = pshufhw(auVar139,auVar164,0x84);
              auVar139 = (auVar141 | auVar92 & auVar139) ^ auVar136;
              auVar139 = packssdw(auVar139,auVar139);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._10_2_ >> 8 & 1) != 0) {
                puVar31[-0x2c] = 0xff;
              }
              auVar139 = (auVar137 | _DAT_005eb890) ^ auVar51;
              auVar98._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar98._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar98._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar98._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar160._4_4_ = auVar98._0_4_;
              auVar160._0_4_ = auVar98._0_4_;
              auVar160._8_4_ = auVar98._8_4_;
              auVar160._12_4_ = auVar98._8_4_;
              auVar92 = pshuflw(auVar164,auVar160,0xe8);
              auVar62._0_4_ = -(uint)(auVar139._0_4_ == iVar12);
              auVar62._4_4_ = -(uint)(auVar139._4_4_ == iVar37);
              auVar62._8_4_ = -(uint)(auVar139._8_4_ == iVar35);
              auVar62._12_4_ = -(uint)(auVar139._12_4_ == iVar20);
              auVar151._4_4_ = auVar62._4_4_;
              auVar151._0_4_ = auVar62._4_4_;
              auVar151._8_4_ = auVar62._12_4_;
              auVar151._12_4_ = auVar62._12_4_;
              auVar139 = pshuflw(auVar62,auVar151,0xe8);
              auVar152._4_4_ = auVar98._4_4_;
              auVar152._0_4_ = auVar98._4_4_;
              auVar152._8_4_ = auVar98._12_4_;
              auVar152._12_4_ = auVar98._12_4_;
              auVar141 = pshuflw(auVar98,auVar152,0xe8);
              auVar139 = packssdw(auVar139 & auVar92,(auVar141 | auVar139 & auVar92) ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar31[-0x30] = 0xff;
              }
              auVar152 = auVar151 & auVar160 | auVar152;
              auVar141 = packssdw(auVar152,auVar152);
              auVar139 = packssdw(auVar139,auVar141 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139._12_2_ >> 8 & 1) != 0) {
                puVar31[-0x34] = 0xff;
              }
              auVar139 = (auVar137 | _DAT_005eb880) ^ auVar51;
              auVar63._0_4_ = -(uint)(iVar12 < auVar139._0_4_);
              auVar63._4_4_ = -(uint)(iVar37 < auVar139._4_4_);
              auVar63._8_4_ = -(uint)(iVar35 < auVar139._8_4_);
              auVar63._12_4_ = -(uint)(iVar20 < auVar139._12_4_);
              auVar153._4_4_ = auVar63._0_4_;
              auVar153._0_4_ = auVar63._0_4_;
              auVar153._8_4_ = auVar63._8_4_;
              auVar153._12_4_ = auVar63._8_4_;
              auVar138._4_4_ = -(uint)(auVar139._4_4_ == iVar37);
              auVar138._12_4_ = -(uint)(auVar139._12_4_ == iVar20);
              auVar138._0_4_ = auVar138._4_4_;
              auVar138._8_4_ = auVar138._12_4_;
              auVar140._4_4_ = auVar63._4_4_;
              auVar140._0_4_ = auVar63._4_4_;
              auVar140._8_4_ = auVar63._12_4_;
              auVar140._12_4_ = auVar63._12_4_;
              auVar141 = auVar138 & auVar153 | auVar140;
              auVar139 = packssdw(auVar63,auVar141);
              auVar139 = packssdw(auVar139 ^ auVar136,auVar139 ^ auVar136);
              auVar139 = packsswb(auVar139,auVar139);
              if ((auVar139 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar31[-0x38] = 0xff;
              }
              auVar139 = pshufhw(auVar139,auVar153,0x84);
              in_XMM2 = pshufhw(auVar141,auVar138,0x84);
              in_XMM2 = in_XMM2 & auVar139;
              auVar139 = pshufhw(auVar139,auVar140,0x84);
              auVar139 = (auVar139 | in_XMM2) ^ auVar136;
              auVar139 = packssdw(auVar139,auVar139);
              in_XMM1 = packsswb(auVar139,auVar139);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar31[-0x3c] = 0xff;
              }
              uVar44 = uVar44 + 0x10;
              puVar31 = puVar31 + -0x40;
            } while ((uVar40 + 0x10 & 0x3ffffff0) != uVar44);
          }
          if ((int)uVar41 < 1) {
            sVar28 = s->img_x;
          }
          else {
            sVar28 = s->img_x;
            if (0 < (int)sVar14 >> 1) {
              uVar41 = sVar28 * 4;
              uVar44 = 1;
              if (1 < (int)uVar41) {
                uVar44 = (ulong)uVar41;
              }
              uVar13 = (sVar14 - 1) * sVar28 * 4;
              uVar46 = 0;
              uVar45 = 0;
              do {
                if (0 < (int)sVar28) {
                  uVar36 = 0;
                  do {
                    uVar1 = *(undefined1 *)((long)pvVar22 + uVar36 + uVar46);
                    *(undefined1 *)((long)pvVar22 + uVar36 + uVar46) =
                         *(undefined1 *)((long)pvVar22 + uVar36 + uVar13);
                    *(undefined1 *)((long)pvVar22 + uVar36 + uVar13) = uVar1;
                    uVar36 = uVar36 + 1;
                  } while (uVar44 != uVar36);
                }
                uVar45 = uVar45 + 1;
                uVar13 = uVar13 + sVar28 * -4;
                uVar46 = (ulong)((int)uVar46 + uVar41);
              } while (uVar45 != (uint)((int)sVar14 >> 1));
            }
          }
          *x = sVar28;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return pvVar22;
          }
          return pvVar22;
        }
        uVar13 = s->img_x * 2 & 2;
LAB_0043b4fd:
        if ((local_88cc.mg != 0 && local_88cc.mr != 0) && local_88cc.mb != 0) {
          iVar12 = stbi__high_bit(local_88cc.mr);
          uVar40 = stbi__bitcount(local_88cc.mr);
          iVar37 = stbi__high_bit(local_88cc.mg);
          uVar15 = stbi__bitcount(local_88cc.mg);
          iVar35 = stbi__high_bit(local_88cc.mb);
          uVar16 = stbi__bitcount(local_88cc.mb);
          iVar20 = stbi__high_bit(local_88cc.ma);
          uVar17 = stbi__bitcount(local_88cc.ma);
          if ((uVar16 < 9 && (uVar15 < 9 && uVar40 < 9)) && uVar17 < 9) {
            iVar12 = iVar12 + -7;
            iVar37 = iVar37 + -7;
            iVar35 = iVar35 + -7;
            iVar20 = iVar20 + -7;
            bVar8 = true;
            bVar4 = false;
            goto LAB_0043c043;
          }
        }
        free(pvVar22);
        lVar39 = *in_FS_OFFSET;
        pcVar29 = "bad masks";
        goto LAB_0043a2c6;
      }
LAB_0043b36a:
      lVar39 = *in_FS_OFFSET;
      pcVar29 = "outofmem";
      goto LAB_0043a2c6;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar34 = s->buffer_start;
      iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      psVar30 = s->img_buffer_original;
      s->callback_already_read = s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
      if (iVar12 == 0) {
        s->read_from_callbacks = 0;
        psVar23 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar7 = '\0';
      }
      else {
        psVar23 = psVar34 + iVar12;
        sVar7 = *psVar34;
      }
      s->img_buffer_end = psVar23;
      psVar34 = s->buffer_start + 1;
      s->img_buffer = psVar34;
      goto LAB_00439a31;
    }
LAB_00439c05:
    s->img_buffer = psVar30;
    psVar23 = s->img_buffer_original_end;
    s->img_buffer_end = psVar23;
LAB_00439c1a:
    if (psVar30 < psVar23) {
      psVar34 = psVar30 + 1;
      s->img_buffer = psVar34;
      sVar7 = *psVar30;
LAB_00439c98:
      if (sVar7 != 'G') goto LAB_0043a0a4;
      if (psVar34 < psVar23) {
        psVar26 = psVar34 + 1;
        s->img_buffer = psVar26;
        sVar7 = *psVar34;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0043a0a4;
        psVar34 = s->buffer_start;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        psVar30 = s->img_buffer_original;
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          psVar23 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar7 = '\0';
        }
        else {
          psVar23 = psVar34 + iVar12;
          sVar7 = *psVar34;
        }
        s->img_buffer_end = psVar23;
        psVar26 = s->buffer_start + 1;
        s->img_buffer = psVar26;
      }
      if (sVar7 != 'I') goto LAB_0043a0a4;
      if (psVar26 < psVar23) {
        psVar34 = psVar26 + 1;
        s->img_buffer = psVar34;
        sVar7 = *psVar26;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0043a0a4;
        psVar34 = s->buffer_start;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        psVar30 = s->img_buffer_original;
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          psVar23 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar7 = '\0';
        }
        else {
          psVar23 = psVar34 + iVar12;
          sVar7 = *psVar34;
        }
        s->img_buffer_end = psVar23;
        psVar34 = s->buffer_start + 1;
        s->img_buffer = psVar34;
      }
      if (sVar7 != 'F') goto LAB_0043a0a4;
      if (psVar34 < psVar23) {
        psVar26 = psVar34 + 1;
        s->img_buffer = psVar26;
        sVar7 = *psVar34;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0043a0a4;
        psVar34 = s->buffer_start;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        psVar30 = s->img_buffer_original;
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          psVar23 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar7 = '\0';
        }
        else {
          psVar23 = psVar34 + iVar12;
          sVar7 = *psVar34;
        }
        s->img_buffer_end = psVar23;
        psVar26 = s->buffer_start + 1;
        s->img_buffer = psVar26;
      }
      if (sVar7 != '8') goto LAB_0043a0a4;
      if (psVar26 < psVar23) {
        psVar34 = psVar26 + 1;
        s->img_buffer = psVar34;
        sVar7 = *psVar26;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0043a0a4;
        psVar34 = s->buffer_start;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        psVar30 = s->img_buffer_original;
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          psVar23 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar7 = '\0';
        }
        else {
          psVar23 = psVar34 + iVar12;
          sVar7 = *psVar34;
        }
        s->img_buffer_end = psVar23;
        psVar34 = s->buffer_start + 1;
        s->img_buffer = psVar34;
      }
      if ((sVar7 != '9') && (sVar7 != '7')) goto LAB_0043a0a4;
      if (psVar34 < psVar23) {
        s->img_buffer = psVar34 + 1;
        sVar7 = *psVar34;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0043a0a4;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
        psVar30 = s->img_buffer_original;
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar7 = '\0';
        }
        else {
          sVar7 = s->buffer_start[0];
        }
      }
      s->img_buffer = psVar30;
      s->img_buffer_end = s->img_buffer_original_end;
      if (sVar7 == 'a') {
        memset(&local_88a8,0,0x8870);
        iVar12 = stbi__gif_header(s,&local_88a8,comp,0);
        if (iVar12 != 0) {
          iVar12 = local_88a8.w;
          iVar37 = local_88a8.h;
          iVar35 = stbi__mad3sizes_valid(4,local_88a8.w,local_88a8.h,0);
          if (iVar35 == 0) {
            local_8988 = "too large";
          }
          else {
            iVar35 = iVar37 * iVar12;
            __size = (size_t)(iVar35 * 4);
            psVar21 = (stbi__context *)malloc(__size);
            local_88a8.out = (stbi_uc *)psVar21;
            psVar24 = (stbi__context *)malloc(__size);
            local_88a8.background = (stbi_uc *)psVar24;
            __s = (stbi__context *)malloc((long)iVar35);
            local_8988 = "outofmem";
            local_88a8.history = (stbi_uc *)__s;
            if ((psVar21 != (stbi__context *)0x0) &&
               (__s != (stbi__context *)0x0 && psVar24 != (stbi__context *)0x0)) {
              memset(psVar21,0,__size);
              memset(psVar24,0,__size);
              uVar44 = (ulong)(uint)local_88a8.transparent;
              memset(__s,0,(long)iVar35);
              psVar23 = s->buffer_start;
              psVar30 = s->buffer_start + 1;
              local_8988 = "unknown code";
LAB_0043a6cc:
              pbVar3 = s->img_buffer;
              psVar34 = s->img_buffer_end;
              if (pbVar3 < psVar34) {
                s->img_buffer = pbVar3 + 1;
                bVar9 = *pbVar3;
                psVar26 = pbVar3 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_0043aa9c;
                iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                s->callback_already_read =
                     s->callback_already_read +
                     (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                if (iVar35 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar9 = 0;
                  psVar34 = psVar30;
                }
                else {
                  bVar9 = *psVar23;
                  psVar34 = psVar23 + iVar35;
                }
                s->img_buffer_end = psVar34;
                s->img_buffer = psVar30;
                psVar26 = psVar30;
              }
              if (bVar9 == 0x21) {
                if (psVar26 < psVar34) {
                  s->img_buffer = psVar26 + 1;
                  bVar9 = *psVar26;
                  psVar26 = psVar26 + 1;
                }
                else {
                  if (s->read_from_callbacks == 0) goto LAB_0043aa05;
                  iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  s->callback_already_read =
                       s->callback_already_read +
                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                  if (iVar35 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar9 = 0;
                    psVar34 = psVar30;
                  }
                  else {
                    bVar9 = *psVar23;
                    psVar34 = psVar23 + iVar35;
                  }
                  s->img_buffer_end = psVar34;
                  s->img_buffer = psVar30;
                  psVar26 = psVar30;
                }
                if (bVar9 != 0xf9) goto LAB_0043aa05;
                if (psVar26 < psVar34) {
                  s->img_buffer = psVar26 + 1;
                  bVar9 = *psVar26;
                  psVar26 = psVar26 + 1;
LAB_0043a84b:
                  if (bVar9 == 4) {
                    if (psVar26 < psVar34) {
                      s->img_buffer = psVar26 + 1;
                      uVar41 = (uint)*psVar26;
                    }
                    else if (s->read_from_callbacks == 0) {
                      uVar41 = 0;
                    }
                    else {
                      iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar35 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        uVar41 = 0;
                        psVar34 = psVar30;
                      }
                      else {
                        uVar41 = (uint)*psVar23;
                        psVar34 = psVar23 + iVar35;
                      }
                      s->img_buffer_end = psVar34;
                      s->img_buffer = psVar30;
                    }
                    local_88a8.eflags = uVar41;
                    local_88a8.delay = stbi__get16le(s);
                    local_88a8.delay = local_88a8.delay * 10;
                    if (-1 < (int)(uint)uVar44) {
                      local_88a8.pal[uVar44][3] = 0xff;
                    }
                    if ((uVar41 & 1) != 0) {
                      pbVar3 = s->img_buffer;
                      if (pbVar3 < s->img_buffer_end) {
                        s->img_buffer = pbVar3 + 1;
                        bVar9 = *pbVar3;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar9 = 0;
                      }
                      else {
                        iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar35 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar9 = 0;
                          psVar34 = psVar30;
                        }
                        else {
                          bVar9 = *psVar23;
                          psVar34 = psVar23 + iVar35;
                        }
                        s->img_buffer_end = psVar34;
                        s->img_buffer = psVar30;
                      }
                      uVar44 = (ulong)bVar9;
                      local_88a8.transparent = (int)bVar9;
                      local_88a8.pal[uVar44][3] = '\0';
                      goto LAB_0043aa05;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
                      psVar34 = s->img_buffer;
LAB_0043a9a2:
                      s->img_buffer = psVar34 + 1;
                    }
                    else {
                      psVar34 = s->img_buffer;
                      iVar35 = (int)s->img_buffer_end - (int)psVar34;
                      if (0 < iVar35) goto LAB_0043a9a2;
                      s->img_buffer = s->img_buffer_end;
                      (*(s->io).skip)(s->io_user_data,1 - iVar35);
                    }
                    local_88a8.transparent = 0xffffffff;
                    uVar44 = 0xffffffff;
LAB_0043aa05:
                    do {
                      pbVar3 = s->img_buffer;
                      if (pbVar3 < s->img_buffer_end) {
                        s->img_buffer = pbVar3 + 1;
                        bVar9 = *pbVar3;
                      }
                      else {
                        if (s->read_from_callbacks == 0) goto LAB_0043a6cc;
                        iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar35 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar9 = 0;
                          psVar34 = psVar30;
                        }
                        else {
                          bVar9 = *psVar23;
                          psVar34 = psVar23 + iVar35;
                        }
                        s->img_buffer_end = psVar34;
                        s->img_buffer = psVar30;
                      }
                      if (bVar9 == 0) goto LAB_0043a6cc;
                      stbi__skip(s,(uint)bVar9);
                    } while( true );
                  }
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar35 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar34 = psVar30;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar34 = psVar23 + iVar35;
                    }
                    s->img_buffer_end = psVar34;
                    s->img_buffer = psVar30;
                    psVar26 = psVar30;
                    goto LAB_0043a84b;
                  }
                  bVar9 = 0;
                }
                stbi__skip(s,(uint)bVar9);
                goto LAB_0043a6cc;
              }
              if (bVar9 == 0x3b) goto LAB_0043aab4;
              if (bVar9 == 0x2c) {
                iVar35 = stbi__get16le(s);
                iVar20 = stbi__get16le(s);
                iVar161 = stbi__get16le(s);
                iVar165 = stbi__get16le(s);
                local_8988 = "bad Image Descriptor";
                if ((iVar161 + iVar35 <= iVar12) && (iVar165 + iVar20 <= iVar37)) {
                  iVar37 = iVar12 * 4;
                  local_88a8.start_x = iVar35 << 2;
                  local_88a8.start_y = iVar20 * iVar37;
                  local_88a8.max_x = (iVar161 + iVar35) * 4;
                  local_88a8.max_y = (iVar165 + iVar20) * iVar37;
                  local_88a8.cur_y = local_88a8.max_y;
                  if (iVar161 != 0) {
                    local_88a8.cur_y = local_88a8.start_y;
                  }
                  psVar34 = s->img_buffer;
                  psVar26 = s->img_buffer_end;
                  local_88a8.cur_x = local_88a8.start_x;
                  local_88a8.line_size = iVar37;
                  if (psVar34 < psVar26) {
                    s->img_buffer = psVar34 + 1;
                    local_88a8.lflags = (int)*psVar34;
                    psVar34 = psVar34 + 1;
LAB_0043d044:
                    local_88a8.step = iVar12 << 5;
                    if ((local_88a8.lflags & 0x40U) == 0) {
                      local_88a8.step = iVar37;
                    }
                    local_88a8.parse = (local_88a8.lflags << 0x19) >> 0x1f & 3;
                    if (-1 < (char)(byte)local_88a8.lflags) goto LAB_0043d080;
                    stbi__gif_parse_colortable
                              (s,local_88a8.lpal,2 << ((byte)local_88a8.lflags & 7),
                               -(uint)((local_88a8.eflags & 1U) == 0) | (uint)uVar44);
                    psVar34 = s->img_buffer;
                    psVar26 = s->img_buffer_end;
                    local_88a8.color_table = local_88a8.lpal[0];
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar35 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        local_88a8.lflags = 0;
                        psVar26 = psVar30;
                      }
                      else {
                        local_88a8.lflags = (int)*psVar23;
                        psVar26 = psVar23 + iVar35;
                      }
                      s->img_buffer_end = psVar26;
                      s->img_buffer = psVar30;
                      psVar34 = psVar30;
                      goto LAB_0043d044;
                    }
                    local_88a8.lflags = 0;
                    local_88a8.parse = 0;
                    local_88a8.step = iVar37;
LAB_0043d080:
                    if ((local_88a8.flags & 0x80U) == 0) {
                      local_8988 = "missing color table";
                      goto LAB_0043aa9c;
                    }
                    local_88a8.color_table = local_88a8.pal[0];
                  }
                  if (psVar34 < psVar26) {
                    s->img_buffer = psVar34 + 1;
                    bVar9 = *psVar34;
                  }
                  else {
                    if (s->read_from_callbacks == 0) {
                      bVar9 = 0;
                      goto LAB_0043d169;
                    }
                    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar12 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar34 = psVar30;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar34 = psVar23 + iVar12;
                    }
                    s->img_buffer_end = psVar34;
                    s->img_buffer = psVar30;
                  }
                  if (bVar9 < 0xd) {
LAB_0043d169:
                    uVar41 = 1 << (bVar9 & 0x1f);
                    uVar44 = 0;
                    do {
                      local_88a8.codes[uVar44].prefix = -1;
                      local_88a8.codes[uVar44].first = (stbi_uc)uVar44;
                      local_88a8.codes[uVar44].suffix = (stbi_uc)uVar44;
                      uVar44 = uVar44 + 1;
                    } while (uVar41 != uVar44);
                    uVar16 = (2 << (bVar9 & 0x1f)) - 1;
                    local_8990 = 0;
                    uVar17 = 0;
                    iVar12 = 0;
                    bVar32 = 0;
                    uVar13 = uVar41 + 2;
                    uVar40 = 0xffffffff;
                    iVar37 = bVar9 + 1;
                    uVar15 = uVar16;
LAB_0043d204:
                    do {
                      for (; uVar18 = uVar15, iVar35 = iVar37, uVar33 = uVar40, local_89a0 = uVar13,
                          bVar5 = bVar32, iVar37 = iVar12 - iVar35, iVar12 < iVar35;
                          iVar12 = iVar12 + 8) {
                        psVar34 = s->img_buffer;
                        psVar26 = s->img_buffer_end;
                        if (uVar17 == 0) {
                          if (psVar34 < psVar26) {
                            s->img_buffer = psVar34 + 1;
                            bVar32 = *psVar34;
                            psVar34 = psVar34 + 1;
                          }
                          else {
                            if (s->read_from_callbacks == 0) goto LAB_0043d4f7;
                            iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                            s->callback_already_read =
                                 s->callback_already_read +
                                 (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                            if (iVar37 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar32 = 0;
                              psVar26 = psVar30;
                            }
                            else {
                              bVar32 = *psVar23;
                              psVar26 = psVar23 + iVar37;
                            }
                            s->img_buffer_end = psVar26;
                            s->img_buffer = psVar30;
                            psVar34 = psVar30;
                          }
                          if (bVar32 == 0) goto LAB_0043d4f7;
                          uVar17 = (uint)bVar32;
                        }
                        if (psVar34 < psVar26) {
                          s->img_buffer = psVar34 + 1;
                          bVar32 = *psVar34;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar32 = 0;
                        }
                        else {
                          iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar37 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar32 = 0;
                            psVar34 = psVar30;
                          }
                          else {
                            bVar32 = *psVar23;
                            psVar34 = psVar23 + iVar37;
                          }
                          s->img_buffer_end = psVar34;
                          s->img_buffer = psVar30;
                        }
                        bVar27 = (byte)iVar12;
                        uVar17 = uVar17 - 1;
                        local_8990 = local_8990 | (uint)bVar32 << (bVar27 & 0x1f);
                        bVar32 = bVar5;
                        uVar13 = local_89a0;
                        uVar40 = uVar33;
                        iVar37 = iVar35;
                        uVar15 = uVar18;
                      }
                      uVar13 = (int)local_8990 >> ((byte)iVar35 & 0x1f);
                      uVar38 = local_8990 & uVar18;
                      iVar12 = iVar37;
                      local_8990 = uVar13;
                      bVar32 = 1;
                      uVar13 = uVar41 + 2;
                      uVar40 = 0xffffffff;
                      iVar37 = bVar9 + 1;
                      uVar15 = uVar16;
                    } while (uVar38 == uVar41);
                    if (uVar38 == uVar41 + 1) goto LAB_0043d469;
                    local_8988 = "no clear code";
                    if ((int)local_89a0 < (int)uVar38) {
                      local_8988 = "illegal code in raster";
                      goto LAB_0043aa9c;
                    }
                    if ((bool)(bVar5 ^ 1)) goto LAB_0043aa9c;
                    if ((int)uVar33 < 0) {
                      if (uVar38 == local_89a0) goto LAB_0043d5a8;
                    }
                    else {
                      if (0x1fff < (int)local_89a0) {
                        local_8988 = "too many codes";
                        goto LAB_0043aa9c;
                      }
                      local_88a8.codes[(int)local_89a0].prefix = (stbi__int16)uVar33;
                      sVar7 = local_88a8.codes[uVar33].first;
                      local_88a8.codes[(int)local_89a0].first = sVar7;
                      if (uVar38 != local_89a0 + 1) {
                        sVar7 = local_88a8.codes[(int)uVar38].first;
                      }
                      local_88a8.codes[(int)local_89a0].suffix = sVar7;
                      local_89a0 = local_89a0 + 1;
                    }
                    stbi__out_gif_code(&local_88a8,(stbi__uint16)uVar38);
                    bVar32 = 1;
                    uVar13 = local_89a0;
                    uVar40 = uVar38;
                    iVar37 = iVar35 + 1;
                    uVar15 = ~(-1 << ((byte)(iVar35 + 1) & 0x1f));
                    if (0xfff < (int)local_89a0 || (local_89a0 & uVar18) != 0) {
                      iVar37 = iVar35;
                      uVar15 = uVar18;
                    }
                    goto LAB_0043d204;
                  }
                  goto LAB_0043aab4;
                }
              }
            }
          }
LAB_0043aa9c:
          *(char **)(*in_FS_OFFSET + -8) = local_8988;
        }
LAB_0043aab4:
        if ((stbi__context *)local_88a8.out != (stbi__context *)0x0) {
          free(local_88a8.out);
        }
        goto LAB_0043aac6;
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar34 = s->buffer_start;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        psVar30 = s->img_buffer_original;
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar30);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          psVar23 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar7 = '\0';
        }
        else {
          psVar23 = psVar34 + iVar12;
          sVar7 = *psVar34;
        }
        s->img_buffer_end = psVar23;
        psVar34 = s->buffer_start + 1;
        s->img_buffer = psVar34;
        goto LAB_00439c98;
      }
LAB_0043a0a4:
      s->img_buffer = psVar30;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    iVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar13 | iVar12 << 0x10) != 0x38425053) {
      iVar12 = stbi__pic_test(s);
      if (iVar12 != 0) {
        pvVar22 = stbi__pic_load(s,x,y,comp,uVar41,ri_00);
        return pvVar22;
      }
      iVar12 = stbi__jpeg_test(s);
      if (iVar12 != 0) {
        pvVar22 = stbi__jpeg_load(s,x,y,comp,uVar41,ri_00);
        return pvVar22;
      }
      iVar12 = stbi__pnm_test(s);
      if (iVar12 != 0) {
        pvVar22 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar22;
      }
      iVar12 = stbi__hdr_test(s);
      if (iVar12 != 0) {
        data = stbi__hdr_load(s,x,y,comp,uVar41,ri_00);
        psVar23 = stbi__hdr_to_ldr(data,*x,*y,(int)comp);
        return psVar23;
      }
      iVar12 = stbi__tga_test(s);
      if (iVar12 != 0) {
        pvVar22 = stbi__tga_load(s,x,y,comp,uVar41,ri_00);
        return pvVar22;
      }
      lVar39 = *in_FS_OFFSET;
      pcVar29 = "unknown image type";
      goto LAB_0043a2c6;
    }
    iVar12 = stbi__get16be(s);
    uVar41 = stbi__get16be(s);
    if ((uVar41 | iVar12 << 0x10) != 0x38425053) {
      lVar39 = *in_FS_OFFSET;
      pcVar29 = "not PSD";
      goto LAB_0043a2c6;
    }
    iVar12 = stbi__get16be(s);
    if (iVar12 != 1) {
      lVar39 = *in_FS_OFFSET;
      pcVar29 = "wrong version";
      goto LAB_0043a2c6;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar23 = s->img_buffer;
LAB_0043a22a:
      s->img_buffer = psVar23 + 6;
    }
    else {
      psVar23 = s->img_buffer;
      iVar12 = (int)s->img_buffer_end - (int)psVar23;
      if (5 < iVar12) goto LAB_0043a22a;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar12);
    }
    uVar41 = stbi__get16be(s);
    if (0x10 < uVar41) {
      lVar39 = *in_FS_OFFSET;
      pcVar29 = "wrong channel count";
      goto LAB_0043a2c6;
    }
    iVar12 = stbi__get16be(s);
    uVar15 = iVar12 * 0x10000;
    uVar13 = stbi__get16be(s);
    iVar37 = uVar13 + uVar15;
    iVar12 = stbi__get16be(s);
    uVar40 = stbi__get16be(s);
    if (iVar37 < 0x1000001) {
      uVar16 = iVar12 * 0x10000;
      iVar12 = uVar40 + uVar16;
      if (iVar12 < 0x1000001) {
        iVar35 = stbi__get16be(s);
        if ((iVar35 != 8) && (iVar35 != 0x10)) {
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "unsupported bit depth";
          goto LAB_0043a2c6;
        }
        iVar20 = stbi__get16be(s);
        if (iVar20 != 3) {
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "wrong color format";
          goto LAB_0043a2c6;
        }
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        uVar17 = stbi__get16be(s);
        if (1 < uVar17) {
          lVar39 = *in_FS_OFFSET;
          pcVar29 = "bad compression";
          goto LAB_0043a2c6;
        }
        iVar20 = stbi__mad3sizes_valid(4,iVar12,iVar37,0);
        if (iVar20 != 0) {
          if ((((int)ri == 0x10) && (iVar35 == 0x10)) && (uVar17 == 0)) {
            pvVar22 = stbi__malloc_mad3(8,iVar12,iVar37,0);
            *piVar42 = 0x10;
          }
          else {
            pvVar22 = malloc((long)(iVar37 * iVar12 * 4));
          }
          if (pvVar22 != (void *)0x0) {
            iVar20 = iVar12 * iVar37;
            if (uVar17 == 0) {
              psVar23 = s->buffer_start;
              psVar30 = s->buffer_start + 1;
              lVar39 = (ulong)((uVar13 | uVar15) * (uVar40 | uVar16)) - 1;
              auVar51._8_4_ = (int)lVar39;
              auVar51._0_8_ = lVar39;
              auVar51._12_4_ = (int)((ulong)lVar39 >> 0x20);
              lVar48 = (long)pvVar22 + 0x3c;
              uVar17 = (uVar13 + uVar15) * (uVar40 + uVar16);
              lVar39 = (long)pvVar22 + 0x38;
              uVar44 = 0;
              auVar135._8_4_ = 0xffffffff;
              auVar135._0_8_ = 0xffffffffffffffff;
              auVar135._12_4_ = 0xffffffff;
              auVar128 = _DAT_005ce310;
              local_8968 = pvVar22;
              local_8960 = pvVar22;
              do {
                if (uVar44 < uVar41) {
                  if (*piVar42 == 0x10) {
                    if (0 < iVar20) {
                      lVar47 = 0;
                      do {
                        iVar161 = stbi__get16be(s);
                        auVar128 = _DAT_005ce310;
                        auVar135._8_4_ = 0xffffffff;
                        auVar135._0_8_ = 0xffffffffffffffff;
                        auVar135._12_4_ = 0xffffffff;
                        *(short *)((long)local_8960 + lVar47 * 8) = (short)iVar161;
                        lVar47 = lVar47 + 1;
                      } while (uVar17 != (uint)lVar47);
                    }
                  }
                  else if (iVar35 == 0x10) {
                    if (0 < iVar20) {
                      lVar47 = 0;
                      do {
                        iVar161 = stbi__get16be(s);
                        auVar128 = _DAT_005ce310;
                        auVar135._8_4_ = 0xffffffff;
                        auVar135._0_8_ = 0xffffffffffffffff;
                        auVar135._12_4_ = 0xffffffff;
                        *(char *)((long)local_8968 + lVar47 * 4) = (char)((uint)iVar161 >> 8);
                        lVar47 = lVar47 + 1;
                      } while (uVar17 != (uint)lVar47);
                    }
                  }
                  else if (0 < iVar20) {
                    psVar34 = s->img_buffer;
                    psVar26 = s->img_buffer_end;
                    lVar47 = 0;
                    do {
                      if (psVar34 < psVar26) {
                        s->img_buffer = psVar34 + 1;
                        sVar7 = *psVar34;
                        psVar34 = psVar34 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        sVar7 = '\0';
                      }
                      else {
                        iVar161 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar161 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          sVar7 = '\0';
                          psVar26 = psVar30;
                        }
                        else {
                          sVar7 = *psVar23;
                          psVar26 = psVar23 + iVar161;
                        }
                        auVar128 = _DAT_005ce310;
                        auVar135._8_4_ = 0xffffffff;
                        auVar135._0_8_ = 0xffffffffffffffff;
                        auVar135._12_4_ = 0xffffffff;
                        s->img_buffer_end = psVar26;
                        s->img_buffer = psVar30;
                        psVar34 = psVar30;
                      }
                      *(stbi_uc *)((long)local_8968 + lVar47 * 4) = sVar7;
                      lVar47 = lVar47 + 1;
                    } while (uVar17 != (uint)lVar47);
                  }
                }
                else if (iVar35 == 0x10 && (int)ri == 0x10) {
                  if (0 < iVar20) {
                    sVar11 = -(ushort)(uVar44 == 3);
                    uVar46 = 0;
                    do {
                      auVar52._8_4_ = (int)uVar46;
                      auVar52._0_8_ = uVar46;
                      auVar52._12_4_ = (int)(uVar46 >> 0x20);
                      auVar57 = auVar51 ^ auVar128;
                      auVar76 = (auVar52 | _DAT_005ce300) ^ auVar128;
                      iVar161 = auVar57._0_4_;
                      iVar126 = -(uint)(iVar161 < auVar76._0_4_);
                      iVar165 = auVar57._4_4_;
                      auVar78._4_4_ = -(uint)(iVar165 < auVar76._4_4_);
                      iVar19 = auVar57._8_4_;
                      iVar127 = -(uint)(iVar19 < auVar76._8_4_);
                      iVar118 = auVar57._12_4_;
                      auVar78._12_4_ = -(uint)(iVar118 < auVar76._12_4_);
                      auVar109._4_4_ = iVar126;
                      auVar109._0_4_ = iVar126;
                      auVar109._8_4_ = iVar127;
                      auVar109._12_4_ = iVar127;
                      auVar57 = pshuflw(in_XMM5,auVar109,0xe8);
                      auVar77._4_4_ = -(uint)(auVar76._4_4_ == iVar165);
                      auVar77._12_4_ = -(uint)(auVar76._12_4_ == iVar118);
                      auVar77._0_4_ = auVar77._4_4_;
                      auVar77._8_4_ = auVar77._12_4_;
                      auVar133 = pshuflw(in_XMM6,auVar77,0xe8);
                      auVar78._0_4_ = auVar78._4_4_;
                      auVar78._8_4_ = auVar78._12_4_;
                      auVar76 = pshuflw(auVar57,auVar78,0xe8);
                      auVar76 = (auVar76 | auVar133 & auVar57) ^ auVar135;
                      auVar76 = packssdw(auVar76,auVar76);
                      if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8 + -0x38) = sVar11;
                      }
                      auVar78 = auVar77 & auVar109 | auVar78;
                      auVar76 = packssdw(auVar78,auVar78);
                      auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                      if ((auVar76._0_4_ >> 0x10 & 1) != 0) {
                        *(short *)(lVar39 + uVar46 * 8 + -0x30) = sVar11;
                      }
                      auVar76 = (auVar52 | _DAT_005ce320) ^ auVar128;
                      iVar126 = -(uint)(iVar161 < auVar76._0_4_);
                      auVar123._4_4_ = -(uint)(iVar165 < auVar76._4_4_);
                      iVar127 = -(uint)(iVar19 < auVar76._8_4_);
                      auVar123._12_4_ = -(uint)(iVar118 < auVar76._12_4_);
                      auVar79._4_4_ = iVar126;
                      auVar79._0_4_ = iVar126;
                      auVar79._8_4_ = iVar127;
                      auVar79._12_4_ = iVar127;
                      auVar110._4_4_ = -(uint)(auVar76._4_4_ == iVar165);
                      auVar110._12_4_ = -(uint)(auVar76._12_4_ == iVar118);
                      auVar110._0_4_ = auVar110._4_4_;
                      auVar110._8_4_ = auVar110._12_4_;
                      auVar123._0_4_ = auVar123._4_4_;
                      auVar123._8_4_ = auVar123._12_4_;
                      auVar76 = auVar110 & auVar79 | auVar123;
                      auVar76 = packssdw(auVar76,auVar76);
                      auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                      if ((auVar76 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8 + -0x28) = sVar11;
                      }
                      auVar80 = pshufhw(auVar79,auVar79,0x84);
                      auVar141 = pshufhw(auVar110,auVar110,0x84);
                      auVar139 = pshufhw(auVar80,auVar123,0x84);
                      auVar80 = (auVar139 | auVar141 & auVar80) ^ auVar135;
                      auVar80 = packssdw(auVar80,auVar80);
                      if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8 + -0x20) = sVar11;
                      }
                      auVar80 = (auVar52 | _DAT_005eb870) ^ auVar128;
                      iVar126 = -(uint)(iVar161 < auVar80._0_4_);
                      auVar82._4_4_ = -(uint)(iVar165 < auVar80._4_4_);
                      iVar127 = -(uint)(iVar19 < auVar80._8_4_);
                      auVar82._12_4_ = -(uint)(iVar118 < auVar80._12_4_);
                      auVar111._4_4_ = iVar126;
                      auVar111._0_4_ = iVar126;
                      auVar111._8_4_ = iVar127;
                      auVar111._12_4_ = iVar127;
                      auVar76 = pshuflw(auVar76,auVar111,0xe8);
                      auVar81._4_4_ = -(uint)(auVar80._4_4_ == iVar165);
                      auVar81._12_4_ = -(uint)(auVar80._12_4_ == iVar118);
                      auVar81._0_4_ = auVar81._4_4_;
                      auVar81._8_4_ = auVar81._12_4_;
                      in_XMM6 = pshuflw(auVar133 & auVar57,auVar81,0xe8);
                      in_XMM6 = in_XMM6 & auVar76;
                      auVar82._0_4_ = auVar82._4_4_;
                      auVar82._8_4_ = auVar82._12_4_;
                      auVar57 = pshuflw(auVar76,auVar82,0xe8);
                      auVar57 = (auVar57 | in_XMM6) ^ auVar135;
                      in_XMM5 = packssdw(auVar57,auVar57);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8 + -0x18) = sVar11;
                      }
                      auVar82 = auVar81 & auVar111 | auVar82;
                      auVar57 = packssdw(auVar82,auVar82);
                      auVar57 = packssdw(auVar57 ^ auVar135,auVar57 ^ auVar135);
                      if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8 + -0x10) = sVar11;
                      }
                      auVar57 = (auVar52 | _DAT_005eb860) ^ auVar128;
                      auVar112._0_4_ = -(uint)(iVar161 < auVar57._0_4_);
                      auVar112._4_4_ = -(uint)(iVar165 < auVar57._4_4_);
                      auVar112._8_4_ = -(uint)(iVar19 < auVar57._8_4_);
                      auVar112._12_4_ = -(uint)(iVar118 < auVar57._12_4_);
                      auVar83._4_4_ = auVar112._0_4_;
                      auVar83._0_4_ = auVar112._0_4_;
                      auVar83._8_4_ = auVar112._8_4_;
                      auVar83._12_4_ = auVar112._8_4_;
                      auVar53._4_4_ = -(uint)(auVar57._4_4_ == iVar165);
                      auVar53._12_4_ = -(uint)(auVar57._12_4_ == iVar118);
                      auVar53._0_4_ = auVar53._4_4_;
                      auVar53._8_4_ = auVar53._12_4_;
                      auVar58._4_4_ = auVar112._4_4_;
                      auVar58._0_4_ = auVar112._4_4_;
                      auVar58._8_4_ = auVar112._12_4_;
                      auVar58._12_4_ = auVar112._12_4_;
                      auVar57 = packssdw(auVar112,auVar53 & auVar83 | auVar58);
                      auVar57 = packssdw(auVar57 ^ auVar135,auVar57 ^ auVar135);
                      if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8 + -8) = sVar11;
                      }
                      auVar133 = pshufhw(auVar83,auVar83,0x84);
                      auVar57 = pshufhw(auVar53,auVar53,0x84);
                      auVar76 = pshufhw(auVar58,auVar58,0x84);
                      auVar57 = packssdw(auVar57 & auVar133,
                                         (auVar76 | auVar57 & auVar133) ^ auVar135);
                      if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(short *)(lVar39 + uVar46 * 8) = sVar11;
                      }
                      uVar46 = uVar46 + 8;
                    } while (((ulong)uVar17 + 7 & 0xfffffffffffffff8) != uVar46);
                  }
                }
                else if (0 < iVar20) {
                  cVar10 = -(uVar44 == 3);
                  uVar46 = 0;
                  do {
                    auVar57._8_4_ = (int)uVar46;
                    auVar57._0_8_ = uVar46;
                    auVar57._12_4_ = (int)(uVar46 >> 0x20);
                    auVar76 = auVar51 ^ auVar128;
                    auVar133 = (auVar57 | _DAT_005ce300) ^ auVar128;
                    iVar161 = auVar76._0_4_;
                    iVar126 = -(uint)(iVar161 < auVar133._0_4_);
                    iVar165 = auVar76._4_4_;
                    auVar80._4_4_ = -(uint)(iVar165 < auVar133._4_4_);
                    iVar19 = auVar76._8_4_;
                    iVar127 = -(uint)(iVar19 < auVar133._8_4_);
                    iVar118 = auVar76._12_4_;
                    auVar80._12_4_ = -(uint)(iVar118 < auVar133._12_4_);
                    auVar139._4_4_ = iVar126;
                    auVar139._0_4_ = iVar126;
                    auVar139._8_4_ = iVar127;
                    auVar139._12_4_ = iVar127;
                    auVar141 = pshuflw(in_XMM5,auVar139,0xe8);
                    auVar76._4_4_ = -(uint)(auVar133._4_4_ == iVar165);
                    auVar76._12_4_ = -(uint)(auVar133._12_4_ == iVar118);
                    auVar76._0_4_ = auVar76._4_4_;
                    auVar76._8_4_ = auVar76._12_4_;
                    auVar92 = pshuflw(in_XMM6,auVar76,0xe8);
                    auVar80._0_4_ = auVar80._4_4_;
                    auVar80._8_4_ = auVar80._12_4_;
                    auVar133 = pshuflw(auVar141,auVar80,0xe8);
                    auVar133 = (auVar133 | auVar92 & auVar141) ^ auVar135;
                    auVar133 = packssdw(auVar133,auVar133);
                    if ((auVar133 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x3c) = cVar10;
                    }
                    auVar80 = auVar76 & auVar139 | auVar80;
                    auVar76 = packssdw(auVar80,auVar80);
                    auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._0_4_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x38) = cVar10;
                    }
                    auVar76 = (auVar57 | _DAT_005ce320) ^ auVar128;
                    iVar126 = -(uint)(iVar161 < auVar76._0_4_);
                    auVar102._4_4_ = -(uint)(iVar165 < auVar76._4_4_);
                    iVar127 = -(uint)(iVar19 < auVar76._8_4_);
                    auVar102._12_4_ = -(uint)(iVar118 < auVar76._12_4_);
                    auVar133._4_4_ = iVar126;
                    auVar133._0_4_ = iVar126;
                    auVar133._8_4_ = iVar127;
                    auVar133._12_4_ = iVar127;
                    auVar129._4_4_ = -(uint)(auVar76._4_4_ == iVar165);
                    auVar129._12_4_ = -(uint)(auVar76._12_4_ == iVar118);
                    auVar129._0_4_ = auVar129._4_4_;
                    auVar129._8_4_ = auVar129._12_4_;
                    auVar102._0_4_ = auVar102._4_4_;
                    auVar102._8_4_ = auVar102._12_4_;
                    auVar76 = auVar129 & auVar133 | auVar102;
                    auVar76 = packssdw(auVar76,auVar76);
                    auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x34) = cVar10;
                    }
                    auVar133 = pshufhw(auVar133,auVar133,0x84);
                    auVar139 = pshufhw(auVar129,auVar129,0x84);
                    auVar80 = pshufhw(auVar133,auVar102,0x84);
                    auVar133 = (auVar80 | auVar139 & auVar133) ^ auVar135;
                    auVar133 = packssdw(auVar133,auVar133);
                    auVar133 = packsswb(auVar133,auVar133);
                    if ((auVar133._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x30) = cVar10;
                    }
                    auVar133 = (auVar57 | _DAT_005eb870) ^ auVar128;
                    iVar126 = -(uint)(iVar161 < auVar133._0_4_);
                    auVar85._4_4_ = -(uint)(iVar165 < auVar133._4_4_);
                    iVar127 = -(uint)(iVar19 < auVar133._8_4_);
                    auVar85._12_4_ = -(uint)(iVar118 < auVar133._12_4_);
                    auVar113._4_4_ = iVar126;
                    auVar113._0_4_ = iVar126;
                    auVar113._8_4_ = iVar127;
                    auVar113._12_4_ = iVar127;
                    auVar76 = pshuflw(auVar76,auVar113,0xe8);
                    auVar84._4_4_ = -(uint)(auVar133._4_4_ == iVar165);
                    auVar84._12_4_ = -(uint)(auVar133._12_4_ == iVar118);
                    auVar84._0_4_ = auVar84._4_4_;
                    auVar84._8_4_ = auVar84._12_4_;
                    auVar80 = pshuflw(auVar92 & auVar141,auVar84,0xe8);
                    auVar85._0_4_ = auVar85._4_4_;
                    auVar85._8_4_ = auVar85._12_4_;
                    auVar133 = pshuflw(auVar76,auVar85,0xe8);
                    auVar133 = (auVar133 | auVar80 & auVar76) ^ auVar135;
                    auVar133 = packssdw(auVar133,auVar133);
                    auVar133 = packsswb(auVar133,auVar133);
                    if ((auVar133 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x2c) = cVar10;
                    }
                    auVar85 = auVar84 & auVar113 | auVar85;
                    auVar133 = packssdw(auVar85,auVar85);
                    auVar133 = packssdw(auVar133 ^ auVar135,auVar133 ^ auVar135);
                    auVar133 = packsswb(auVar133,auVar133);
                    if ((auVar133._4_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x28) = cVar10;
                    }
                    auVar133 = (auVar57 | _DAT_005eb860) ^ auVar128;
                    iVar126 = -(uint)(iVar161 < auVar133._0_4_);
                    auVar124._4_4_ = -(uint)(iVar165 < auVar133._4_4_);
                    iVar127 = -(uint)(iVar19 < auVar133._8_4_);
                    auVar124._12_4_ = -(uint)(iVar118 < auVar133._12_4_);
                    auVar141._4_4_ = iVar126;
                    auVar141._0_4_ = iVar126;
                    auVar141._8_4_ = iVar127;
                    auVar141._12_4_ = iVar127;
                    auVar92._4_4_ = -(uint)(auVar133._4_4_ == iVar165);
                    auVar92._12_4_ = -(uint)(auVar133._12_4_ == iVar118);
                    auVar92._0_4_ = auVar92._4_4_;
                    auVar92._8_4_ = auVar92._12_4_;
                    auVar124._0_4_ = auVar124._4_4_;
                    auVar124._8_4_ = auVar124._12_4_;
                    auVar133 = auVar92 & auVar141 | auVar124;
                    auVar133 = packssdw(auVar133,auVar133);
                    auVar133 = packssdw(auVar133 ^ auVar135,auVar133 ^ auVar135);
                    auVar133 = packsswb(auVar133,auVar133);
                    if ((auVar133 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x24) = cVar10;
                    }
                    auVar139 = pshufhw(auVar141,auVar141,0x84);
                    auVar92 = pshufhw(auVar92,auVar92,0x84);
                    auVar141 = pshufhw(auVar139,auVar124,0x84);
                    auVar139 = (auVar141 | auVar92 & auVar139) ^ auVar135;
                    auVar139 = packssdw(auVar139,auVar139);
                    auVar139 = packsswb(auVar139,auVar139);
                    if ((auVar139._6_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x20) = cVar10;
                    }
                    auVar139 = (auVar57 | _DAT_005eb8b0) ^ auVar128;
                    iVar126 = -(uint)(iVar161 < auVar139._0_4_);
                    auVar87._4_4_ = -(uint)(iVar165 < auVar139._4_4_);
                    iVar127 = -(uint)(iVar19 < auVar139._8_4_);
                    auVar87._12_4_ = -(uint)(iVar118 < auVar139._12_4_);
                    auVar114._4_4_ = iVar126;
                    auVar114._0_4_ = iVar126;
                    auVar114._8_4_ = iVar127;
                    auVar114._12_4_ = iVar127;
                    auVar133 = pshuflw(auVar133,auVar114,0xe8);
                    auVar86._4_4_ = -(uint)(auVar139._4_4_ == iVar165);
                    auVar86._12_4_ = -(uint)(auVar139._12_4_ == iVar118);
                    auVar86._0_4_ = auVar86._4_4_;
                    auVar86._8_4_ = auVar86._12_4_;
                    auVar80 = pshuflw(auVar80 & auVar76,auVar86,0xe8);
                    auVar87._0_4_ = auVar87._4_4_;
                    auVar87._8_4_ = auVar87._12_4_;
                    auVar76 = pshuflw(auVar133,auVar87,0xe8);
                    auVar76 = (auVar76 | auVar80 & auVar133) ^ auVar135;
                    auVar76 = packssdw(auVar76,auVar76);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x1c) = cVar10;
                    }
                    auVar87 = auVar86 & auVar114 | auVar87;
                    auVar76 = packssdw(auVar87,auVar87);
                    auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._8_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x18) = cVar10;
                    }
                    auVar76 = (auVar57 | _DAT_005eb8a0) ^ auVar128;
                    iVar126 = -(uint)(iVar161 < auVar76._0_4_);
                    auVar125._4_4_ = -(uint)(iVar165 < auVar76._4_4_);
                    iVar127 = -(uint)(iVar19 < auVar76._8_4_);
                    auVar125._12_4_ = -(uint)(iVar118 < auVar76._12_4_);
                    auVar88._4_4_ = iVar126;
                    auVar88._0_4_ = iVar126;
                    auVar88._8_4_ = iVar127;
                    auVar88._12_4_ = iVar127;
                    auVar115._4_4_ = -(uint)(auVar76._4_4_ == iVar165);
                    auVar115._12_4_ = -(uint)(auVar76._12_4_ == iVar118);
                    auVar115._0_4_ = auVar115._4_4_;
                    auVar115._8_4_ = auVar115._12_4_;
                    auVar125._0_4_ = auVar125._4_4_;
                    auVar125._8_4_ = auVar125._12_4_;
                    auVar76 = auVar115 & auVar88 | auVar125;
                    auVar76 = packssdw(auVar76,auVar76);
                    auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x14) = cVar10;
                    }
                    auVar139 = pshufhw(auVar88,auVar88,0x84);
                    auVar92 = pshufhw(auVar115,auVar115,0x84);
                    auVar141 = pshufhw(auVar139,auVar125,0x84);
                    auVar139 = (auVar141 | auVar92 & auVar139) ^ auVar135;
                    auVar139 = packssdw(auVar139,auVar139);
                    auVar139 = packsswb(auVar139,auVar139);
                    if ((auVar139._10_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0x10) = cVar10;
                    }
                    auVar139 = (auVar57 | _DAT_005eb890) ^ auVar128;
                    iVar126 = -(uint)(iVar161 < auVar139._0_4_);
                    auVar90._4_4_ = -(uint)(iVar165 < auVar139._4_4_);
                    iVar127 = -(uint)(iVar19 < auVar139._8_4_);
                    auVar90._12_4_ = -(uint)(iVar118 < auVar139._12_4_);
                    auVar116._4_4_ = iVar126;
                    auVar116._0_4_ = iVar126;
                    auVar116._8_4_ = iVar127;
                    auVar116._12_4_ = iVar127;
                    auVar76 = pshuflw(auVar76,auVar116,0xe8);
                    auVar89._4_4_ = -(uint)(auVar139._4_4_ == iVar165);
                    auVar89._12_4_ = -(uint)(auVar139._12_4_ == iVar118);
                    auVar89._0_4_ = auVar89._4_4_;
                    auVar89._8_4_ = auVar89._12_4_;
                    in_XMM6 = pshuflw(auVar80 & auVar133,auVar89,0xe8);
                    in_XMM6 = in_XMM6 & auVar76;
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar76 = pshuflw(auVar76,auVar90,0xe8);
                    auVar76 = (auVar76 | in_XMM6) ^ auVar135;
                    auVar76 = packssdw(auVar76,auVar76);
                    in_XMM5 = packsswb(auVar76,auVar76);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -0xc) = cVar10;
                    }
                    auVar90 = auVar89 & auVar116 | auVar90;
                    auVar76 = packssdw(auVar90,auVar90);
                    auVar76 = packssdw(auVar76 ^ auVar135,auVar76 ^ auVar135);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._12_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4 + -8) = cVar10;
                    }
                    auVar57 = (auVar57 | _DAT_005eb880) ^ auVar128;
                    auVar117._0_4_ = -(uint)(iVar161 < auVar57._0_4_);
                    auVar117._4_4_ = -(uint)(iVar165 < auVar57._4_4_);
                    auVar117._8_4_ = -(uint)(iVar19 < auVar57._8_4_);
                    auVar117._12_4_ = -(uint)(iVar118 < auVar57._12_4_);
                    auVar91._4_4_ = auVar117._0_4_;
                    auVar91._0_4_ = auVar117._0_4_;
                    auVar91._8_4_ = auVar117._8_4_;
                    auVar91._12_4_ = auVar117._8_4_;
                    auVar54._4_4_ = -(uint)(auVar57._4_4_ == iVar165);
                    auVar54._12_4_ = -(uint)(auVar57._12_4_ == iVar118);
                    auVar54._0_4_ = auVar54._4_4_;
                    auVar54._8_4_ = auVar54._12_4_;
                    auVar59._4_4_ = auVar117._4_4_;
                    auVar59._0_4_ = auVar117._4_4_;
                    auVar59._8_4_ = auVar117._12_4_;
                    auVar59._12_4_ = auVar117._12_4_;
                    auVar57 = packssdw(auVar117,auVar54 & auVar91 | auVar59);
                    auVar57 = packssdw(auVar57 ^ auVar135,auVar57 ^ auVar135);
                    auVar57 = packsswb(auVar57,auVar57);
                    if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar48 + uVar46 * 4 + -4) = cVar10;
                    }
                    auVar133 = pshufhw(auVar91,auVar91,0x84);
                    auVar57 = pshufhw(auVar54,auVar54,0x84);
                    auVar76 = pshufhw(auVar59,auVar59,0x84);
                    auVar57 = packssdw(auVar57 & auVar133,(auVar76 | auVar57 & auVar133) ^ auVar135)
                    ;
                    auVar57 = packsswb(auVar57,auVar57);
                    if ((auVar57._14_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar48 + uVar46 * 4) = cVar10;
                    }
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)uVar17 + 0xf & 0xfffffffffffffff0) != uVar46);
                }
                uVar44 = uVar44 + 1;
                lVar48 = lVar48 + 1;
                lVar39 = lVar39 + 2;
                local_8968 = (void *)((long)local_8968 + 1);
                local_8960 = (void *)((long)local_8960 + 2);
              } while (uVar44 != 4);
            }
            else {
              stbi__skip(s,uVar41 * iVar37 * 2);
              lVar39 = (ulong)((uVar13 | uVar15) * (uVar40 | uVar16)) - 1;
              auVar134._8_4_ = (int)lVar39;
              auVar134._0_8_ = lVar39;
              auVar134._12_4_ = (int)((ulong)lVar39 >> 0x20);
              lVar39 = (long)pvVar22 + 0x3c;
              uVar44 = 0;
              auVar128 = _DAT_005eb880;
              auVar51 = _DAT_005eb890;
              auVar135 = _DAT_005eb8a0;
              auVar57 = _DAT_005eb8b0;
              auVar76 = _DAT_005eb860;
              auVar133 = _DAT_005eb870;
              auVar80 = _DAT_005ce320;
              auVar139 = _DAT_005ce300;
              do {
                if (uVar44 < uVar41) {
                  iVar35 = stbi__psd_decode_rle(s,(stbi_uc *)((long)pvVar22 + uVar44),iVar20);
                  auVar128 = _DAT_005eb880;
                  auVar51 = _DAT_005eb890;
                  auVar135 = _DAT_005eb8a0;
                  auVar57 = _DAT_005eb8b0;
                  auVar76 = _DAT_005eb860;
                  auVar133 = _DAT_005eb870;
                  auVar80 = _DAT_005ce320;
                  auVar139 = _DAT_005ce300;
                  if (iVar35 == 0) {
                    free(pvVar22);
                    lVar39 = *in_FS_OFFSET;
                    pcVar29 = "corrupt";
                    goto LAB_0043a2c6;
                  }
                }
                else if (0 < iVar20) {
                  cVar10 = -(uVar44 == 3);
                  uVar46 = 0;
                  do {
                    auVar49._8_4_ = (int)uVar46;
                    auVar49._0_8_ = uVar46;
                    auVar49._12_4_ = (int)(uVar46 >> 0x20);
                    auVar141 = auVar134 ^ _DAT_005ce310;
                    auVar92 = (auVar49 | auVar139) ^ _DAT_005ce310;
                    iVar35 = auVar141._0_4_;
                    iVar118 = -(uint)(iVar35 < auVar92._0_4_);
                    iVar161 = auVar141._4_4_;
                    auVar65._4_4_ = -(uint)(iVar161 < auVar92._4_4_);
                    iVar165 = auVar141._8_4_;
                    iVar126 = -(uint)(iVar165 < auVar92._8_4_);
                    iVar19 = auVar141._12_4_;
                    auVar65._12_4_ = -(uint)(iVar19 < auVar92._12_4_);
                    auVar100._4_4_ = iVar118;
                    auVar100._0_4_ = iVar118;
                    auVar100._8_4_ = iVar126;
                    auVar100._12_4_ = iVar126;
                    auVar141 = pshuflw(in_XMM5,auVar100,0xe8);
                    auVar64._4_4_ = -(uint)(auVar92._4_4_ == iVar161);
                    auVar64._12_4_ = -(uint)(auVar92._12_4_ == iVar19);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar129 = pshuflw(in_XMM6,auVar64,0xe8);
                    auVar65._0_4_ = auVar65._4_4_;
                    auVar65._8_4_ = auVar65._12_4_;
                    auVar92 = pshuflw(auVar141,auVar65,0xe8);
                    auVar130._8_4_ = 0xffffffff;
                    auVar130._0_8_ = 0xffffffffffffffff;
                    auVar130._12_4_ = 0xffffffff;
                    auVar141 = (auVar92 | auVar129 & auVar141) ^ auVar130;
                    auVar141 = packssdw(auVar141,auVar141);
                    if ((auVar141 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x3c) = cVar10;
                    }
                    auVar65 = auVar64 & auVar100 | auVar65;
                    auVar141 = packssdw(auVar65,auVar65);
                    auVar141 = packssdw(auVar141 ^ auVar130,auVar141 ^ auVar130);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141._0_4_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x38) = cVar10;
                    }
                    auVar141 = (auVar49 | auVar80) ^ _DAT_005ce310;
                    iVar118 = -(uint)(iVar35 < auVar141._0_4_);
                    auVar120._4_4_ = -(uint)(iVar161 < auVar141._4_4_);
                    iVar126 = -(uint)(iVar165 < auVar141._8_4_);
                    auVar120._12_4_ = -(uint)(iVar19 < auVar141._12_4_);
                    auVar66._4_4_ = iVar118;
                    auVar66._0_4_ = iVar118;
                    auVar66._8_4_ = iVar126;
                    auVar66._12_4_ = iVar126;
                    auVar101._4_4_ = -(uint)(auVar141._4_4_ == iVar161);
                    auVar101._12_4_ = -(uint)(auVar141._12_4_ == iVar19);
                    auVar101._0_4_ = auVar101._4_4_;
                    auVar101._8_4_ = auVar101._12_4_;
                    auVar120._0_4_ = auVar120._4_4_;
                    auVar120._8_4_ = auVar120._12_4_;
                    auVar141 = auVar101 & auVar66 | auVar120;
                    auVar141 = packssdw(auVar141,auVar141);
                    auVar141 = packssdw(auVar141 ^ auVar130,auVar141 ^ auVar130);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x34) = cVar10;
                    }
                    auVar92 = pshufhw(auVar66,auVar66,0x84);
                    auVar102 = pshufhw(auVar101,auVar101,0x84);
                    auVar129 = pshufhw(auVar92,auVar120,0x84);
                    auVar92 = (auVar129 | auVar102 & auVar92) ^ auVar130;
                    auVar92 = packssdw(auVar92,auVar92);
                    auVar92 = packsswb(auVar92,auVar92);
                    if ((auVar92._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x30) = cVar10;
                    }
                    auVar92 = (auVar49 | auVar133) ^ _DAT_005ce310;
                    iVar118 = -(uint)(iVar35 < auVar92._0_4_);
                    auVar68._4_4_ = -(uint)(iVar161 < auVar92._4_4_);
                    iVar126 = -(uint)(iVar165 < auVar92._8_4_);
                    auVar68._12_4_ = -(uint)(iVar19 < auVar92._12_4_);
                    auVar103._4_4_ = iVar118;
                    auVar103._0_4_ = iVar118;
                    auVar103._8_4_ = iVar126;
                    auVar103._12_4_ = iVar126;
                    auVar141 = pshuflw(auVar141,auVar103,0xe8);
                    auVar67._4_4_ = -(uint)(auVar92._4_4_ == iVar161);
                    auVar67._12_4_ = -(uint)(auVar92._12_4_ == iVar19);
                    auVar67._0_4_ = auVar67._4_4_;
                    auVar67._8_4_ = auVar67._12_4_;
                    auVar129 = pshuflw(auVar130,auVar67,0xe8);
                    auVar68._0_4_ = auVar68._4_4_;
                    auVar68._8_4_ = auVar68._12_4_;
                    auVar92 = pshuflw(auVar141,auVar68,0xe8);
                    auVar131._8_4_ = 0xffffffff;
                    auVar131._0_8_ = 0xffffffffffffffff;
                    auVar131._12_4_ = 0xffffffff;
                    auVar141 = (auVar92 | auVar129 & auVar141) ^ auVar131;
                    auVar141 = packssdw(auVar141,auVar141);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x2c) = cVar10;
                    }
                    auVar68 = auVar67 & auVar103 | auVar68;
                    auVar141 = packssdw(auVar68,auVar68);
                    auVar141 = packssdw(auVar141 ^ auVar131,auVar141 ^ auVar131);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141._4_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x28) = cVar10;
                    }
                    auVar141 = (auVar49 | auVar76) ^ _DAT_005ce310;
                    iVar118 = -(uint)(iVar35 < auVar141._0_4_);
                    auVar121._4_4_ = -(uint)(iVar161 < auVar141._4_4_);
                    iVar126 = -(uint)(iVar165 < auVar141._8_4_);
                    auVar121._12_4_ = -(uint)(iVar19 < auVar141._12_4_);
                    auVar69._4_4_ = iVar118;
                    auVar69._0_4_ = iVar118;
                    auVar69._8_4_ = iVar126;
                    auVar69._12_4_ = iVar126;
                    auVar104._4_4_ = -(uint)(auVar141._4_4_ == iVar161);
                    auVar104._12_4_ = -(uint)(auVar141._12_4_ == iVar19);
                    auVar104._0_4_ = auVar104._4_4_;
                    auVar104._8_4_ = auVar104._12_4_;
                    auVar121._0_4_ = auVar121._4_4_;
                    auVar121._8_4_ = auVar121._12_4_;
                    auVar141 = auVar104 & auVar69 | auVar121;
                    auVar141 = packssdw(auVar141,auVar141);
                    auVar141 = packssdw(auVar141 ^ auVar131,auVar141 ^ auVar131);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x24) = cVar10;
                    }
                    auVar92 = pshufhw(auVar69,auVar69,0x84);
                    auVar102 = pshufhw(auVar104,auVar104,0x84);
                    auVar129 = pshufhw(auVar92,auVar121,0x84);
                    auVar92 = (auVar129 | auVar102 & auVar92) ^ auVar131;
                    auVar92 = packssdw(auVar92,auVar92);
                    auVar92 = packsswb(auVar92,auVar92);
                    if ((auVar92._6_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x20) = cVar10;
                    }
                    auVar92 = (auVar49 | auVar57) ^ _DAT_005ce310;
                    iVar118 = -(uint)(iVar35 < auVar92._0_4_);
                    auVar71._4_4_ = -(uint)(iVar161 < auVar92._4_4_);
                    iVar126 = -(uint)(iVar165 < auVar92._8_4_);
                    auVar71._12_4_ = -(uint)(iVar19 < auVar92._12_4_);
                    auVar105._4_4_ = iVar118;
                    auVar105._0_4_ = iVar118;
                    auVar105._8_4_ = iVar126;
                    auVar105._12_4_ = iVar126;
                    auVar141 = pshuflw(auVar141,auVar105,0xe8);
                    auVar70._4_4_ = -(uint)(auVar92._4_4_ == iVar161);
                    auVar70._12_4_ = -(uint)(auVar92._12_4_ == iVar19);
                    auVar70._0_4_ = auVar70._4_4_;
                    auVar70._8_4_ = auVar70._12_4_;
                    auVar129 = pshuflw(auVar131,auVar70,0xe8);
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar92 = pshuflw(auVar141,auVar71,0xe8);
                    auVar132._8_4_ = 0xffffffff;
                    auVar132._0_8_ = 0xffffffffffffffff;
                    auVar132._12_4_ = 0xffffffff;
                    auVar141 = (auVar92 | auVar129 & auVar141) ^ auVar132;
                    auVar141 = packssdw(auVar141,auVar141);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x1c) = cVar10;
                    }
                    auVar71 = auVar70 & auVar105 | auVar71;
                    auVar141 = packssdw(auVar71,auVar71);
                    auVar141 = packssdw(auVar141 ^ auVar132,auVar141 ^ auVar132);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141._8_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x18) = cVar10;
                    }
                    auVar141 = (auVar49 | auVar135) ^ _DAT_005ce310;
                    iVar118 = -(uint)(iVar35 < auVar141._0_4_);
                    auVar122._4_4_ = -(uint)(iVar161 < auVar141._4_4_);
                    iVar126 = -(uint)(iVar165 < auVar141._8_4_);
                    auVar122._12_4_ = -(uint)(iVar19 < auVar141._12_4_);
                    auVar72._4_4_ = iVar118;
                    auVar72._0_4_ = iVar118;
                    auVar72._8_4_ = iVar126;
                    auVar72._12_4_ = iVar126;
                    auVar106._4_4_ = -(uint)(auVar141._4_4_ == iVar161);
                    auVar106._12_4_ = -(uint)(auVar141._12_4_ == iVar19);
                    auVar106._0_4_ = auVar106._4_4_;
                    auVar106._8_4_ = auVar106._12_4_;
                    auVar122._0_4_ = auVar122._4_4_;
                    auVar122._8_4_ = auVar122._12_4_;
                    auVar141 = auVar106 & auVar72 | auVar122;
                    auVar141 = packssdw(auVar141,auVar141);
                    auVar141 = packssdw(auVar141 ^ auVar132,auVar141 ^ auVar132);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x14) = cVar10;
                    }
                    auVar92 = pshufhw(auVar72,auVar72,0x84);
                    auVar102 = pshufhw(auVar106,auVar106,0x84);
                    auVar129 = pshufhw(auVar92,auVar122,0x84);
                    auVar92 = (auVar129 | auVar102 & auVar92) ^ auVar132;
                    auVar92 = packssdw(auVar92,auVar92);
                    auVar92 = packsswb(auVar92,auVar92);
                    if ((auVar92._10_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0x10) = cVar10;
                    }
                    auVar92 = (auVar49 | auVar51) ^ _DAT_005ce310;
                    iVar118 = -(uint)(iVar35 < auVar92._0_4_);
                    auVar74._4_4_ = -(uint)(iVar161 < auVar92._4_4_);
                    iVar126 = -(uint)(iVar165 < auVar92._8_4_);
                    auVar74._12_4_ = -(uint)(iVar19 < auVar92._12_4_);
                    auVar107._4_4_ = iVar118;
                    auVar107._0_4_ = iVar118;
                    auVar107._8_4_ = iVar126;
                    auVar107._12_4_ = iVar126;
                    auVar141 = pshuflw(auVar141,auVar107,0xe8);
                    auVar73._4_4_ = -(uint)(auVar92._4_4_ == iVar161);
                    auVar73._12_4_ = -(uint)(auVar92._12_4_ == iVar19);
                    auVar73._0_4_ = auVar73._4_4_;
                    auVar73._8_4_ = auVar73._12_4_;
                    auVar129 = pshuflw(auVar132,auVar73,0xe8);
                    auVar74._0_4_ = auVar74._4_4_;
                    auVar74._8_4_ = auVar74._12_4_;
                    auVar92 = pshuflw(auVar141,auVar74,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar141 = (auVar92 | auVar129 & auVar141) ^ in_XMM6;
                    auVar141 = packssdw(auVar141,auVar141);
                    in_XMM5 = packsswb(auVar141,auVar141);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -0xc) = cVar10;
                    }
                    auVar74 = auVar73 & auVar107 | auVar74;
                    auVar141 = packssdw(auVar74,auVar74);
                    auVar141 = packssdw(auVar141 ^ in_XMM6,auVar141 ^ in_XMM6);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141._12_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4 + -8) = cVar10;
                    }
                    auVar141 = (auVar49 | auVar128) ^ _DAT_005ce310;
                    auVar108._0_4_ = -(uint)(iVar35 < auVar141._0_4_);
                    auVar108._4_4_ = -(uint)(iVar161 < auVar141._4_4_);
                    auVar108._8_4_ = -(uint)(iVar165 < auVar141._8_4_);
                    auVar108._12_4_ = -(uint)(iVar19 < auVar141._12_4_);
                    auVar75._4_4_ = auVar108._0_4_;
                    auVar75._0_4_ = auVar108._0_4_;
                    auVar75._8_4_ = auVar108._8_4_;
                    auVar75._12_4_ = auVar108._8_4_;
                    auVar50._4_4_ = -(uint)(auVar141._4_4_ == iVar161);
                    auVar50._12_4_ = -(uint)(auVar141._12_4_ == iVar19);
                    auVar50._0_4_ = auVar50._4_4_;
                    auVar50._8_4_ = auVar50._12_4_;
                    auVar56._4_4_ = auVar108._4_4_;
                    auVar56._0_4_ = auVar108._4_4_;
                    auVar56._8_4_ = auVar108._12_4_;
                    auVar56._12_4_ = auVar108._12_4_;
                    auVar141 = packssdw(auVar108,auVar50 & auVar75 | auVar56);
                    auVar141 = packssdw(auVar141 ^ in_XMM6,auVar141 ^ in_XMM6);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(lVar39 + uVar46 * 4 + -4) = cVar10;
                    }
                    auVar129 = pshufhw(auVar75,auVar75,0x84);
                    auVar141 = pshufhw(auVar50,auVar50,0x84);
                    auVar92 = pshufhw(auVar56,auVar56,0x84);
                    auVar141 = packssdw(auVar141 & auVar129,
                                        (auVar92 | auVar141 & auVar129) ^ in_XMM6);
                    auVar141 = packsswb(auVar141,auVar141);
                    if ((auVar141._14_2_ >> 8 & 1) != 0) {
                      *(char *)(lVar39 + uVar46 * 4) = cVar10;
                    }
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)((uVar13 + uVar15) * (uVar40 + uVar16)) + 0xf &
                           0xfffffffffffffff0) != uVar46);
                }
                uVar44 = uVar44 + 1;
                lVar39 = lVar39 + 1;
              } while (uVar44 != 4);
            }
            if (3 < uVar41) {
              if (*piVar42 == 0x10) {
                if (0 < iVar20) {
                  uVar44 = 0;
                  do {
                    uVar2 = *(ushort *)((long)pvVar22 + uVar44 * 8 + 6);
                    if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                      fVar119 = 1.0 / ((float)uVar2 / 65535.0);
                      fVar99 = (1.0 - fVar119) * 65535.0;
                      uVar41 = *(uint *)((long)pvVar22 + uVar44 * 8);
                      auVar128._0_4_ = (int)(fVar99 + fVar119 * (float)(uVar41 & 0xffff));
                      auVar128._4_4_ = (int)(fVar99 + fVar119 * (float)(uVar41 >> 0x10));
                      auVar128._8_4_ = (int)(fVar99 + fVar119 * 0.0);
                      auVar128._12_4_ = (int)(fVar99 + fVar119 * 0.0);
                      auVar128 = pshuflw(auVar128,auVar128,0xe8);
                      *(int *)((long)pvVar22 + uVar44 * 8) = auVar128._0_4_;
                      *(short *)((long)pvVar22 + uVar44 * 8 + 4) =
                           (short)(int)((float)*(ushort *)((long)pvVar22 + uVar44 * 8 + 4) * fVar119
                                       + fVar99);
                    }
                    uVar44 = uVar44 + 1;
                  } while ((uVar13 + uVar15) * (uVar40 + uVar16) != uVar44);
                }
              }
              else if (0 < iVar20) {
                uVar44 = 0;
                do {
                  bVar9 = *(byte *)((long)pvVar22 + uVar44 * 4 + 3);
                  if ((bVar9 != 0) && (bVar9 != 0xff)) {
                    fVar119 = 1.0 / ((float)bVar9 / 255.0);
                    fVar99 = (1.0 - fVar119) * 255.0;
                    *(char *)((long)pvVar22 + uVar44 * 4) =
                         (char)(int)((float)*(byte *)((long)pvVar22 + uVar44 * 4) * fVar119 + fVar99
                                    );
                    *(char *)((long)pvVar22 + uVar44 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)pvVar22 + uVar44 * 4 + 1) * fVar119 +
                                    fVar99);
                    *(char *)((long)pvVar22 + uVar44 * 4 + 2) =
                         (char)(int)((float)*(byte *)((long)pvVar22 + uVar44 * 4 + 2) * fVar119 +
                                    fVar99);
                  }
                  uVar44 = uVar44 + 1;
                } while ((uVar13 + uVar15) * (uVar40 + uVar16) != uVar44);
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = iVar37;
            *x = iVar12;
            return pvVar22;
          }
          goto LAB_0043b36a;
        }
      }
    }
  }
LAB_0043a2b3:
  lVar39 = *in_FS_OFFSET;
  pcVar29 = "too large";
LAB_0043a2c6:
  *(char **)(lVar39 + -8) = pcVar29;
  return (void *)0x0;
LAB_0043d469:
  stbi__skip(s,uVar17);
  pbVar3 = s->img_buffer;
  if (pbVar3 < s->img_buffer_end) {
    s->img_buffer = pbVar3 + 1;
    bVar9 = *pbVar3;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0043d4f7;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar9 = 0;
      psVar34 = psVar30;
    }
    else {
      bVar9 = *psVar23;
      psVar34 = psVar23 + iVar12;
    }
    s->img_buffer_end = psVar34;
    s->img_buffer = psVar30;
  }
  if (bVar9 == 0) goto LAB_0043d4f7;
  uVar17 = (uint)bVar9;
  goto LAB_0043d469;
LAB_0043d5a8:
  local_8988 = "illegal code in raster";
  goto LAB_0043aa9c;
LAB_0043d4f7:
  if ((stbi__context *)local_88a8.out == (stbi__context *)0x0) {
LAB_0043aac6:
    psVar21 = (stbi__context *)0x0;
  }
  else {
    if (0 < local_88a8.h * local_88a8.w && 0 < local_88a8.bgindex) {
      uVar44 = 0;
      do {
        if (((stbi_uc *)((long)local_88a8.history + 0x38))[uVar44 - 0x38] == '\0') {
          local_88a8.pal[local_88a8.bgindex][3] = 0xff;
          *(stbi_uc (*) [4])((stbi_uc *)((long)local_88a8.out + 0x38) + uVar44 * 4 + -0x38) =
               local_88a8.pal[local_88a8.bgindex];
        }
        uVar44 = uVar44 + 1;
      } while ((uint)(local_88a8.h * local_88a8.w) != uVar44);
    }
    if ((stbi__context *)local_88a8.out == s) goto LAB_0043aab4;
    *x = local_88a8.w;
    *y = local_88a8.h;
    psVar21 = (stbi__context *)local_88a8.out;
  }
  free(local_88a8.history);
  psVar24 = (stbi__context *)local_88a8.background;
LAB_004399a5:
  free(psVar24);
  return psVar21;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}